

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  int iVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  byte bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  long lVar84;
  long lVar85;
  Precalculations *pPVar86;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  Geometry *pGVar87;
  undefined8 unaff_R13;
  ulong uVar88;
  ulong uVar89;
  long lVar90;
  size_t sVar91;
  byte bVar92;
  ulong uVar93;
  float fVar94;
  float fVar146;
  float fVar148;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar102 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar152;
  float fVar153;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar167;
  float fVar168;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar169 [32];
  float fVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar190;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar191 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  RTCFilterFunctionNArguments args;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5d0 [16];
  Precalculations *local_5b8;
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  size_t local_550;
  long local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  int local_410;
  int iStack_40c;
  int iStack_408;
  int iStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar81 = (ulong)(byte)prim[1];
  fVar170 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar100 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar158 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar98 = vsubps_avx(auVar100,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  fVar177 = fVar170 * auVar98._0_4_;
  fVar154 = fVar170 * auVar158._0_4_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar81 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar100);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar81 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar101);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar81 * 6 + 6);
  auVar108 = vpmovsxbd_avx2(auVar8);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar81 * 0xb + 6);
  auVar120 = vpmovsxbd_avx2(auVar9);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar81 * 0xc + 6);
  auVar119 = vpmovsxbd_avx2(auVar10);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar81 * 0xd + 6);
  auVar110 = vpmovsxbd_avx2(auVar11);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 * 0x12 + 6);
  auVar111 = vpmovsxbd_avx2(auVar12);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar81 * 0x13 + 6);
  auVar118 = vpmovsxbd_avx2(auVar13);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar81 * 0x14 + 6);
  auVar113 = vpmovsxbd_avx2(auVar99);
  auVar112 = vcvtdq2ps_avx(auVar113);
  auVar213._4_4_ = fVar154;
  auVar213._0_4_ = fVar154;
  auVar213._8_4_ = fVar154;
  auVar213._12_4_ = fVar154;
  auVar213._16_4_ = fVar154;
  auVar213._20_4_ = fVar154;
  auVar213._24_4_ = fVar154;
  auVar213._28_4_ = fVar154;
  auVar215._8_4_ = 1;
  auVar215._0_8_ = 0x100000001;
  auVar215._12_4_ = 1;
  auVar215._16_4_ = 1;
  auVar215._20_4_ = 1;
  auVar215._24_4_ = 1;
  auVar215._28_4_ = 1;
  auVar106 = ZEXT1632(CONCAT412(fVar170 * auVar158._12_4_,
                                CONCAT48(fVar170 * auVar158._8_4_,
                                         CONCAT44(fVar170 * auVar158._4_4_,fVar154))));
  auVar105 = vpermps_avx2(auVar215,auVar106);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar104 = vpermps_avx512vl(auVar103,auVar106);
  fVar154 = auVar104._0_4_;
  auVar196._0_4_ = fVar154 * auVar108._0_4_;
  fVar167 = auVar104._4_4_;
  auVar196._4_4_ = fVar167 * auVar108._4_4_;
  fVar168 = auVar104._8_4_;
  auVar196._8_4_ = fVar168 * auVar108._8_4_;
  fVar179 = auVar104._12_4_;
  auVar196._12_4_ = fVar179 * auVar108._12_4_;
  fVar178 = auVar104._16_4_;
  auVar196._16_4_ = fVar178 * auVar108._16_4_;
  fVar190 = auVar104._20_4_;
  auVar196._20_4_ = fVar190 * auVar108._20_4_;
  fVar94 = auVar104._24_4_;
  auVar196._28_36_ = in_ZMM4._28_36_;
  auVar196._24_4_ = fVar94 * auVar108._24_4_;
  auVar106._4_4_ = auVar110._4_4_ * fVar167;
  auVar106._0_4_ = auVar110._0_4_ * fVar154;
  auVar106._8_4_ = auVar110._8_4_ * fVar168;
  auVar106._12_4_ = auVar110._12_4_ * fVar179;
  auVar106._16_4_ = auVar110._16_4_ * fVar178;
  auVar106._20_4_ = auVar110._20_4_ * fVar190;
  auVar106._24_4_ = auVar110._24_4_ * fVar94;
  auVar106._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar112._4_4_ * fVar167;
  auVar113._0_4_ = auVar112._0_4_ * fVar154;
  auVar113._8_4_ = auVar112._8_4_ * fVar168;
  auVar113._12_4_ = auVar112._12_4_ * fVar179;
  auVar113._16_4_ = auVar112._16_4_ * fVar178;
  auVar113._20_4_ = auVar112._20_4_ * fVar190;
  auVar113._24_4_ = auVar112._24_4_ * fVar94;
  auVar113._28_4_ = auVar104._28_4_;
  auVar100 = vfmadd231ps_fma(auVar196._0_32_,auVar105,auVar107);
  auVar101 = vfmadd231ps_fma(auVar106,auVar105,auVar119);
  auVar8 = vfmadd231ps_fma(auVar113,auVar118,auVar105);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar213,auVar109);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar213,auVar120);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar111,auVar213);
  auVar214._4_4_ = fVar177;
  auVar214._0_4_ = fVar177;
  auVar214._8_4_ = fVar177;
  auVar214._12_4_ = fVar177;
  auVar214._16_4_ = fVar177;
  auVar214._20_4_ = fVar177;
  auVar214._24_4_ = fVar177;
  auVar214._28_4_ = fVar177;
  auVar105 = ZEXT1632(CONCAT412(fVar170 * auVar98._12_4_,
                                CONCAT48(fVar170 * auVar98._8_4_,
                                         CONCAT44(fVar170 * auVar98._4_4_,fVar177))));
  auVar113 = vpermps_avx2(auVar215,auVar105);
  auVar105 = vpermps_avx512vl(auVar103,auVar105);
  auVar106 = vmulps_avx512vl(auVar105,auVar108);
  auVar115._0_4_ = auVar105._0_4_ * auVar110._0_4_;
  auVar115._4_4_ = auVar105._4_4_ * auVar110._4_4_;
  auVar115._8_4_ = auVar105._8_4_ * auVar110._8_4_;
  auVar115._12_4_ = auVar105._12_4_ * auVar110._12_4_;
  auVar115._16_4_ = auVar105._16_4_ * auVar110._16_4_;
  auVar115._20_4_ = auVar105._20_4_ * auVar110._20_4_;
  auVar115._24_4_ = auVar105._24_4_ * auVar110._24_4_;
  auVar115._28_4_ = 0;
  auVar110._4_4_ = auVar105._4_4_ * auVar112._4_4_;
  auVar110._0_4_ = auVar105._0_4_ * auVar112._0_4_;
  auVar110._8_4_ = auVar105._8_4_ * auVar112._8_4_;
  auVar110._12_4_ = auVar105._12_4_ * auVar112._12_4_;
  auVar110._16_4_ = auVar105._16_4_ * auVar112._16_4_;
  auVar110._20_4_ = auVar105._20_4_ * auVar112._20_4_;
  auVar110._24_4_ = auVar105._24_4_ * auVar112._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar107 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar107);
  auVar9 = vfmadd231ps_fma(auVar115,auVar113,auVar119);
  auVar10 = vfmadd231ps_fma(auVar110,auVar113,auVar118);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar214,auVar109);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar214,auVar120);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar214,auVar111);
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar203._16_4_ = 0x7fffffff;
  auVar203._20_4_ = 0x7fffffff;
  auVar203._24_4_ = 0x7fffffff;
  auVar203._28_4_ = 0x7fffffff;
  auVar109 = vandps_avx(ZEXT1632(auVar100),auVar203);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar109,auVar117,1);
  bVar18 = (bool)((byte)uVar88 & 1);
  auVar105._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._0_4_;
  bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._4_4_;
  bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._8_4_;
  bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar100._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar101),auVar203);
  uVar88 = vcmpps_avx512vl(auVar109,auVar117,1);
  bVar18 = (bool)((byte)uVar88 & 1);
  auVar103._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._0_4_;
  bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._4_4_;
  bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._8_4_;
  bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar101._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar8),auVar203);
  uVar88 = vcmpps_avx512vl(auVar109,auVar117,1);
  bVar18 = (bool)((byte)uVar88 & 1);
  auVar109._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._0_4_;
  bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._4_4_;
  bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._8_4_;
  bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar108 = vrcp14ps_avx512vl(auVar105);
  auVar202._8_4_ = 0x3f800000;
  auVar202._0_8_ = 0x3f8000003f800000;
  auVar202._12_4_ = 0x3f800000;
  auVar202._16_4_ = 0x3f800000;
  auVar202._20_4_ = 0x3f800000;
  auVar202._24_4_ = 0x3f800000;
  auVar202._28_4_ = 0x3f800000;
  auVar100 = vfnmadd213ps_fma(auVar105,auVar108,auVar202);
  auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar103);
  auVar101 = vfnmadd213ps_fma(auVar103,auVar108,auVar202);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar108,auVar108);
  auVar108 = vrcp14ps_avx512vl(auVar109);
  auVar8 = vfnmadd213ps_fma(auVar109,auVar108,auVar202);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar108,auVar108);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx512vl(auVar109,auVar107);
  auVar111._4_4_ = auVar100._4_4_ * auVar109._4_4_;
  auVar111._0_4_ = auVar100._0_4_ * auVar109._0_4_;
  auVar111._8_4_ = auVar100._8_4_ * auVar109._8_4_;
  auVar111._12_4_ = auVar100._12_4_ * auVar109._12_4_;
  auVar111._16_4_ = auVar109._16_4_ * 0.0;
  auVar111._20_4_ = auVar109._20_4_ * 0.0;
  auVar111._24_4_ = auVar109._24_4_ * 0.0;
  auVar111._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 9 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx512vl(auVar109,auVar107);
  auVar116._0_4_ = auVar100._0_4_ * auVar109._0_4_;
  auVar116._4_4_ = auVar100._4_4_ * auVar109._4_4_;
  auVar116._8_4_ = auVar100._8_4_ * auVar109._8_4_;
  auVar116._12_4_ = auVar100._12_4_ * auVar109._12_4_;
  auVar116._16_4_ = auVar109._16_4_ * 0.0;
  auVar116._20_4_ = auVar109._20_4_ * 0.0;
  auVar116._24_4_ = auVar109._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0xe + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar9));
  auVar110 = vpbroadcastd_avx512vl();
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar118._4_4_ = auVar101._4_4_ * auVar109._4_4_;
  auVar118._0_4_ = auVar101._0_4_ * auVar109._0_4_;
  auVar118._8_4_ = auVar101._8_4_ * auVar109._8_4_;
  auVar118._12_4_ = auVar101._12_4_ * auVar109._12_4_;
  auVar118._16_4_ = auVar109._16_4_ * 0.0;
  auVar118._20_4_ = auVar109._20_4_ * 0.0;
  auVar118._24_4_ = auVar109._24_4_ * 0.0;
  auVar118._28_4_ = auVar109._28_4_;
  auVar109 = vcvtdq2ps_avx(auVar107);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar9));
  auVar114._0_4_ = auVar101._0_4_ * auVar109._0_4_;
  auVar114._4_4_ = auVar101._4_4_ * auVar109._4_4_;
  auVar114._8_4_ = auVar101._8_4_ * auVar109._8_4_;
  auVar114._12_4_ = auVar101._12_4_ * auVar109._12_4_;
  auVar114._16_4_ = auVar109._16_4_ * 0.0;
  auVar114._20_4_ = auVar109._20_4_ * 0.0;
  auVar114._24_4_ = auVar109._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x15 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar10));
  auVar112._4_4_ = auVar109._4_4_ * auVar8._4_4_;
  auVar112._0_4_ = auVar109._0_4_ * auVar8._0_4_;
  auVar112._8_4_ = auVar109._8_4_ * auVar8._8_4_;
  auVar112._12_4_ = auVar109._12_4_ * auVar8._12_4_;
  auVar112._16_4_ = auVar109._16_4_ * 0.0;
  auVar112._20_4_ = auVar109._20_4_ * 0.0;
  auVar112._24_4_ = auVar109._24_4_ * 0.0;
  auVar112._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 * 0x17 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar10));
  auVar104._0_4_ = auVar8._0_4_ * auVar109._0_4_;
  auVar104._4_4_ = auVar8._4_4_ * auVar109._4_4_;
  auVar104._8_4_ = auVar8._8_4_ * auVar109._8_4_;
  auVar104._12_4_ = auVar8._12_4_ * auVar109._12_4_;
  auVar104._16_4_ = auVar109._16_4_ * 0.0;
  auVar104._20_4_ = auVar109._20_4_ * 0.0;
  auVar104._24_4_ = auVar109._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar111,auVar116);
  auVar107 = vpminsd_avx2(auVar118,auVar114);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107 = vpminsd_avx2(auVar112,auVar104);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar108._4_4_ = uVar155;
  auVar108._0_4_ = uVar155;
  auVar108._8_4_ = uVar155;
  auVar108._12_4_ = uVar155;
  auVar108._16_4_ = uVar155;
  auVar108._20_4_ = uVar155;
  auVar108._24_4_ = uVar155;
  auVar108._28_4_ = uVar155;
  auVar107 = vmaxps_avx512vl(auVar107,auVar108);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  auVar107._16_4_ = 0x3f7ffffa;
  auVar107._20_4_ = 0x3f7ffffa;
  auVar107._24_4_ = 0x3f7ffffa;
  auVar107._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar109,auVar107);
  auVar109 = vpmaxsd_avx2(auVar111,auVar116);
  auVar107 = vpmaxsd_avx2(auVar118,auVar114);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar107 = vpmaxsd_avx2(auVar112,auVar104);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar155;
  auVar120._0_4_ = uVar155;
  auVar120._8_4_ = uVar155;
  auVar120._12_4_ = uVar155;
  auVar120._16_4_ = uVar155;
  auVar120._20_4_ = uVar155;
  auVar120._24_4_ = uVar155;
  auVar120._28_4_ = uVar155;
  auVar107 = vminps_avx512vl(auVar107,auVar120);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar119._8_4_ = 0x3f800003;
  auVar119._0_8_ = 0x3f8000033f800003;
  auVar119._12_4_ = 0x3f800003;
  auVar119._16_4_ = 0x3f800003;
  auVar119._20_4_ = 0x3f800003;
  auVar119._24_4_ = 0x3f800003;
  auVar119._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar119);
  uVar24 = vcmpps_avx512vl(local_80,auVar109,2);
  uVar27 = vpcmpgtd_avx512vl(auVar110,_DAT_01fb4ba0);
  uVar88 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar27));
  local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pPVar86 = pre;
  sVar91 = k;
  local_5b8 = pre;
  local_5b0 = prim;
  local_550 = k;
  do {
    auVar109 = local_500;
    if (uVar88 == 0) {
      return;
    }
    lVar84 = 0;
    for (uVar81 = uVar88; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      lVar84 = lVar84 + 1;
    }
    uVar14 = *(uint *)(prim + 2);
    uVar82 = *(uint *)(prim + lVar84 * 4 + 6);
    local_5a8 = (ulong)uVar82;
    pGVar87 = (context->scene->geometries).items[uVar14].ptr;
    uVar81 = (ulong)*(uint *)(*(long *)&pGVar87->field_0x58 +
                             pGVar87[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_5a8);
    p_Var17 = pGVar87[1].intersectionFilterN;
    lVar84 = *(long *)&pGVar87[1].time_range.upper;
    local_5a0 = *(undefined1 (*) [16])(lVar84 + (long)p_Var17 * uVar81);
    pauVar3 = (undefined1 (*) [16])(lVar84 + (uVar81 + 1) * (long)p_Var17);
    uVar24 = *(undefined8 *)*pauVar3;
    uVar27 = *(undefined8 *)(*pauVar3 + 8);
    auVar13 = *pauVar3;
    auVar11 = *pauVar3;
    auVar9 = *pauVar3;
    auVar100 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar84 + (uVar81 + 2) * (long)p_Var17);
    uVar74 = *(undefined8 *)*pauVar4;
    uVar75 = *(undefined8 *)(*pauVar4 + 8);
    auVar12 = *pauVar4;
    auVar10 = *pauVar4;
    auVar8 = *pauVar4;
    auVar101 = *pauVar4;
    uVar88 = uVar88 - 1 & uVar88;
    pauVar5 = (undefined1 (*) [12])(lVar84 + (uVar81 + 3) * (long)p_Var17);
    uVar76 = *(undefined8 *)*pauVar5;
    uVar77 = *(undefined8 *)(*pauVar5 + 8);
    local_600 = (float)uVar76;
    fStack_5fc = (float)((ulong)uVar76 >> 0x20);
    fStack_5f8 = (float)uVar77;
    fStack_5f4 = (float)((ulong)uVar77 >> 0x20);
    if (uVar88 != 0) {
      uVar89 = uVar88 - 1 & uVar88;
      for (uVar81 = uVar88; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
      if (uVar89 != 0) {
        for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar15 = (int)pGVar87[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar91 * 4)),
                            ZEXT416(*(uint *)(ray + sVar91 * 4 + 0x10)),0x1c);
    auVar99 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + sVar91 * 4 + 0x20)),0x28);
    auVar98 = vsubps_avx(local_5a0,auVar99);
    uVar155 = auVar98._0_4_;
    auVar95._4_4_ = uVar155;
    auVar95._0_4_ = uVar155;
    auVar95._8_4_ = uVar155;
    auVar95._12_4_ = uVar155;
    auVar158 = vshufps_avx(auVar98,auVar98,0x55);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
    fVar170 = pre->ray_space[k].vz.field_0.m128[0];
    fVar154 = pre->ray_space[k].vz.field_0.m128[1];
    fVar167 = pre->ray_space[k].vz.field_0.m128[2];
    fVar168 = pre->ray_space[k].vz.field_0.m128[3];
    auVar205._0_4_ = fVar170 * auVar98._0_4_;
    auVar205._4_4_ = fVar154 * auVar98._4_4_;
    auVar205._8_4_ = fVar167 * auVar98._8_4_;
    auVar205._12_4_ = fVar168 * auVar98._12_4_;
    auVar158 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar7,auVar158);
    auVar205 = vfmadd231ps_fma(auVar158,(undefined1  [16])aVar6,auVar95);
    auVar158 = vshufps_avx(local_5a0,local_5a0,0xff);
    auVar95 = vsubps_avx512vl(auVar100,auVar99);
    uVar155 = auVar95._0_4_;
    auVar180._4_4_ = uVar155;
    auVar180._0_4_ = uVar155;
    auVar180._8_4_ = uVar155;
    auVar180._12_4_ = uVar155;
    auVar98 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar96._0_4_ = fVar170 * auVar95._0_4_;
    auVar96._4_4_ = fVar154 * auVar95._4_4_;
    auVar96._8_4_ = fVar167 * auVar95._8_4_;
    auVar96._12_4_ = fVar168 * auVar95._12_4_;
    auVar98 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar7,auVar98);
    auVar180 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar6,auVar180);
    auVar96 = vshufps_avx512vl(auVar100,auVar100,0xff);
    auVar95 = vsubps_avx512vl(auVar101,auVar99);
    uVar155 = auVar95._0_4_;
    auVar97._4_4_ = uVar155;
    auVar97._0_4_ = uVar155;
    auVar97._8_4_ = uVar155;
    auVar97._12_4_ = uVar155;
    auVar98 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar209._0_4_ = fVar170 * auVar95._0_4_;
    auVar209._4_4_ = fVar154 * auVar95._4_4_;
    auVar209._8_4_ = fVar167 * auVar95._8_4_;
    auVar209._12_4_ = fVar168 * auVar95._12_4_;
    auVar98 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar7,auVar98);
    auVar95 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar6,auVar97);
    auVar97 = vshufps_avx512vl(auVar101,auVar101,0xff);
    auVar29._12_4_ = fStack_5f4;
    auVar29._0_12_ = *pauVar5;
    auVar98 = vsubps_avx512vl(auVar29,auVar99);
    uVar155 = auVar98._0_4_;
    auVar181._4_4_ = uVar155;
    auVar181._0_4_ = uVar155;
    auVar181._8_4_ = uVar155;
    auVar181._12_4_ = uVar155;
    auVar99 = vshufps_avx(auVar98,auVar98,0x55);
    auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar212._0_4_ = fVar170 * auVar98._0_4_;
    auVar212._4_4_ = fVar154 * auVar98._4_4_;
    auVar212._8_4_ = fVar167 * auVar98._8_4_;
    auVar212._12_4_ = fVar168 * auVar98._12_4_;
    auVar99 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar99);
    auVar98 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar6,auVar181);
    auVar99 = vshufps_avx512vl(auVar29,auVar29,0xff);
    lVar84 = (long)iVar15;
    lVar90 = lVar84 * 0x44;
    auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar90);
    uVar155 = auVar205._0_4_;
    local_2a0._4_4_ = uVar155;
    local_2a0._0_4_ = uVar155;
    local_2a0._8_4_ = uVar155;
    local_2a0._12_4_ = uVar155;
    local_2a0._16_4_ = uVar155;
    local_2a0._20_4_ = uVar155;
    local_2a0._24_4_ = uVar155;
    local_2a0._28_4_ = uVar155;
    auVar191._8_4_ = 1;
    auVar191._0_8_ = 0x100000001;
    auVar191._12_4_ = 1;
    auVar191._16_4_ = 1;
    auVar191._20_4_ = 1;
    auVar191._24_4_ = 1;
    auVar191._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar191,ZEXT1632(auVar205));
    local_a0 = vbroadcastsd_avx512vl(auVar158);
    auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x484);
    uVar155 = auVar180._0_4_;
    auVar102._4_4_ = uVar155;
    auVar102._0_4_ = uVar155;
    auVar102._8_4_ = uVar155;
    auVar102._12_4_ = uVar155;
    local_2e0._16_4_ = uVar155;
    local_2e0._0_16_ = auVar102;
    local_2e0._20_4_ = uVar155;
    local_2e0._24_4_ = uVar155;
    local_2e0._28_4_ = uVar155;
    local_300 = vpermps_avx512vl(auVar191,ZEXT1632(auVar180));
    local_c0 = vbroadcastsd_avx512vl(auVar96);
    auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x908);
    uVar155 = auVar95._0_4_;
    local_320._4_4_ = uVar155;
    local_320._0_4_ = uVar155;
    local_320._8_4_ = uVar155;
    local_320._12_4_ = uVar155;
    local_320._16_4_ = uVar155;
    local_320._20_4_ = uVar155;
    local_320._24_4_ = uVar155;
    local_320._28_4_ = uVar155;
    local_340 = vpermps_avx512vl(auVar191,ZEXT1632(auVar95));
    local_e0 = vbroadcastsd_avx512vl(auVar97);
    auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0xd8c);
    fVar154 = auVar98._0_4_;
    local_360._4_4_ = fVar154;
    local_360._0_4_ = fVar154;
    fStack_358 = fVar154;
    fStack_354 = fVar154;
    fStack_350 = fVar154;
    fStack_34c = fVar154;
    fStack_348 = fVar154;
    register0x0000139c = fVar154;
    _local_380 = vpermps_avx512vl(auVar191,ZEXT1632(auVar98));
    local_100 = vbroadcastsd_avx512vl(auVar99);
    auVar110 = vmulps_avx512vl(_local_360,auVar119);
    auVar111 = vmulps_avx512vl(_local_380,auVar119);
    auVar99 = vfmadd231ps_fma(auVar110,auVar120,local_320);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar120,local_340);
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar108,local_2e0);
    auVar112 = vfmadd231ps_avx512vl(auVar110,auVar108,local_300);
    auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar107,local_2a0);
    auVar201 = ZEXT3264(auVar113);
    auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar90);
    auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x484);
    auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x908);
    auVar105 = vfmadd231ps_avx512vl(auVar112,auVar107,local_2c0);
    auVar196 = ZEXT3264(auVar105);
    auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0xd8c);
    auVar106 = vmulps_avx512vl(_local_360,auVar112);
    auVar103 = vmulps_avx512vl(_local_380,auVar112);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_320);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar118,local_340);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar111,local_2e0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar111,local_300);
    auVar158 = vfmadd231ps_fma(auVar106,auVar110,local_2a0);
    auVar204 = ZEXT1664(auVar158);
    auVar96 = vfmadd231ps_fma(auVar103,auVar110,local_2c0);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar158),auVar113);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar96),auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar106);
    auVar114 = vmulps_avx512vl(auVar113,auVar103);
    auVar104 = vsubps_avx512vl(auVar104,auVar114);
    auVar114 = vmulps_avx512vl(local_100,auVar119);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar120,local_e0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar108,local_c0);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,local_a0);
    auVar115 = vmulps_avx512vl(local_100,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_e0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,local_c0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,local_a0);
    auVar116 = vmulps_avx512vl(auVar103,auVar103);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar106,auVar106);
    auVar117 = vmaxps_avx512vl(auVar114,auVar115);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vmulps_avx512vl(auVar117,auVar116);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    uVar25 = vcmpps_avx512vl(auVar104,auVar116,2);
    auVar99 = vblendps_avx(auVar205,local_5a0,8);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar99 = vandps_avx512vl(auVar99,auVar97);
    auVar100 = vblendps_avx(auVar180,auVar100,8);
    auVar100 = vandps_avx512vl(auVar100,auVar97);
    auVar99 = vmaxps_avx(auVar99,auVar100);
    auVar100 = vblendps_avx(auVar95,auVar101,8);
    auVar101 = vandps_avx512vl(auVar100,auVar97);
    auVar100 = vblendps_avx(auVar98,auVar29,8);
    auVar100 = vandps_avx512vl(auVar100,auVar97);
    auVar100 = vmaxps_avx(auVar101,auVar100);
    auVar100 = vmaxps_avx(auVar99,auVar100);
    auVar101 = vmovshdup_avx(auVar100);
    auVar101 = vmaxss_avx(auVar101,auVar100);
    auVar100 = vshufpd_avx(auVar100,auVar100,1);
    auVar100 = vmaxss_avx(auVar100,auVar101);
    auVar210._0_4_ = (float)iVar15;
    local_500._4_12_ = auVar205._4_12_;
    local_500._0_4_ = auVar210._0_4_;
    local_500._16_16_ = auVar109._16_16_;
    auVar210._4_4_ = auVar210._0_4_;
    auVar210._8_4_ = auVar210._0_4_;
    auVar210._12_4_ = auVar210._0_4_;
    auVar210._16_4_ = auVar210._0_4_;
    auVar210._20_4_ = auVar210._0_4_;
    auVar210._24_4_ = auVar210._0_4_;
    auVar210._28_4_ = auVar210._0_4_;
    uVar26 = vcmpps_avx512vl(auVar210,_DAT_01f7b060,0xe);
    bVar92 = (byte)uVar25 & (byte)uVar26;
    fVar170 = auVar100._0_4_ * 4.7683716e-07;
    local_560 = ZEXT416((uint)fVar170);
    auVar186._8_4_ = 2;
    auVar186._0_8_ = 0x200000002;
    auVar186._12_4_ = 2;
    auVar186._16_4_ = 2;
    auVar186._20_4_ = 2;
    auVar186._24_4_ = 2;
    auVar186._28_4_ = 2;
    local_480 = vpermps_avx512vl(auVar186,ZEXT1632(auVar205));
    auVar218 = ZEXT3264(local_480);
    local_4a0 = vpermps_avx512vl(auVar186,ZEXT1632(auVar180));
    auVar220 = ZEXT3264(local_4a0);
    auVar109 = vpermps_avx512vl(auVar186,ZEXT1632(auVar95));
    local_160 = vpermps_avx2(auVar186,ZEXT1632(auVar98));
    local_440 = *(undefined4 *)(ray + sVar91 * 4 + 0x30);
    uStack_43c = 0;
    uStack_438 = 0;
    uStack_434 = 0;
    local_4b0 = vpbroadcastd_avx512vl();
    local_4c0 = vpbroadcastd_avx512vl();
    if (bVar92 != 0) {
      auVar112 = vmulps_avx512vl(local_160,auVar112);
      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar109,auVar112);
      auVar111 = vfmadd213ps_avx512vl(auVar111,local_4a0,auVar118);
      auVar111 = vfmadd213ps_avx512vl(auVar110,local_480,auVar111);
      auVar119 = vmulps_avx512vl(local_160,auVar119);
      auVar120 = vfmadd213ps_avx512vl(auVar120,auVar109,auVar119);
      auVar118 = vfmadd213ps_avx512vl(auVar108,local_4a0,auVar120);
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1694);
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1b18);
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar90 + 0x1f9c);
      auVar118 = vfmadd213ps_avx512vl(auVar107,local_480,auVar118);
      auVar207._0_4_ = fVar154 * auVar110._0_4_;
      auVar207._4_4_ = fVar154 * auVar110._4_4_;
      auVar207._8_4_ = fVar154 * auVar110._8_4_;
      auVar207._12_4_ = fVar154 * auVar110._12_4_;
      auVar207._16_4_ = fVar154 * auVar110._16_4_;
      auVar207._20_4_ = fVar154 * auVar110._20_4_;
      auVar207._24_4_ = fVar154 * auVar110._24_4_;
      auVar207._28_4_ = 0;
      auVar107 = vmulps_avx512vl(_local_380,auVar110);
      auVar110 = vmulps_avx512vl(local_160,auVar110);
      auVar112 = vfmadd231ps_avx512vl(auVar207,auVar119,local_320);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar119,local_340);
      auVar119 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar119);
      auVar110 = vfmadd231ps_avx512vl(auVar112,auVar120,local_2e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,local_300);
      auVar112 = vfmadd231ps_avx512vl(auVar119,local_4a0,auVar120);
      auVar100 = vfmadd231ps_fma(auVar110,auVar108,local_2a0);
      auVar110 = vfmadd231ps_avx512vl(auVar107,auVar108,local_2c0);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1210);
      auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1b18);
      auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1f9c);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_480,auVar108);
      auVar39._4_4_ = fVar154 * auVar119._4_4_;
      auVar39._0_4_ = fVar154 * auVar119._0_4_;
      auVar39._8_4_ = fVar154 * auVar119._8_4_;
      auVar39._12_4_ = fVar154 * auVar119._12_4_;
      auVar39._16_4_ = fVar154 * auVar119._16_4_;
      auVar39._20_4_ = fVar154 * auVar119._20_4_;
      auVar39._24_4_ = fVar154 * auVar119._24_4_;
      auVar39._28_4_ = auVar108._28_4_;
      auVar108 = vmulps_avx512vl(_local_380,auVar119);
      auVar119 = vmulps_avx512vl(local_160,auVar119);
      auVar104 = vfmadd231ps_avx512vl(auVar39,auVar120,local_320);
      auVar116 = vfmadd231ps_avx512vl(auVar108,auVar120,local_340);
      auVar218 = ZEXT3264(local_480);
      auVar220 = ZEXT3264(local_4a0);
      auVar219 = ZEXT3264(auVar109);
      auVar120 = vfmadd231ps_avx512vl(auVar119,auVar109,auVar120);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar90 + 0x1694);
      auVar119 = vfmadd231ps_avx512vl(auVar104,auVar108,local_2e0);
      auVar104 = vfmadd231ps_avx512vl(auVar116,auVar108,local_300);
      auVar108 = vfmadd231ps_avx512vl(auVar120,local_4a0,auVar108);
      auVar101 = vfmadd231ps_fma(auVar119,auVar107,local_2a0);
      auVar120 = vfmadd231ps_avx512vl(auVar104,auVar107,local_2c0);
      auVar119 = vfmadd231ps_avx512vl(auVar108,local_480,auVar107);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(ZEXT1632(auVar100),auVar216);
      auVar108 = vandps_avx(auVar110,auVar216);
      auVar108 = vmaxps_avx(auVar107,auVar108);
      auVar107 = vandps_avx(auVar112,auVar216);
      auVar107 = vmaxps_avx(auVar108,auVar107);
      auVar211._4_4_ = fVar170;
      auVar211._0_4_ = fVar170;
      auVar211._8_4_ = fVar170;
      auVar211._12_4_ = fVar170;
      auVar211._16_4_ = fVar170;
      auVar211._20_4_ = fVar170;
      auVar211._24_4_ = fVar170;
      auVar211._28_4_ = fVar170;
      uVar81 = vcmpps_avx512vl(auVar107,auVar211,1);
      bVar18 = (bool)((byte)uVar81 & 1);
      auVar121._0_4_ = (float)((uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar100._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar100._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar100._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar100._12_4_);
      fVar154 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar106._16_4_);
      auVar121._16_4_ = fVar154;
      fVar167 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar106._20_4_);
      auVar121._20_4_ = fVar167;
      fVar168 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar106._24_4_);
      auVar121._24_4_ = fVar168;
      uVar83 = (uint)(byte)(uVar81 >> 7) * auVar106._28_4_;
      auVar121._28_4_ = uVar83;
      bVar18 = (bool)((byte)uVar81 & 1);
      auVar122._0_4_ = (float)((uint)bVar18 * auVar103._0_4_ | (uint)!bVar18 * auVar110._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar110._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar110._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar110._12_4_);
      bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar122._16_4_ = (float)((uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * auVar110._16_4_);
      bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar122._20_4_ = (float)((uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * auVar110._20_4_);
      bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar122._24_4_ = (float)((uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * auVar110._24_4_);
      bVar18 = SUB81(uVar81 >> 7,0);
      auVar122._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * auVar110._28_4_;
      auVar107 = vandps_avx(auVar216,ZEXT1632(auVar101));
      auVar108 = vandps_avx(auVar120,auVar216);
      auVar108 = vmaxps_avx(auVar107,auVar108);
      auVar107 = vandps_avx(auVar119,auVar216);
      auVar107 = vmaxps_avx(auVar108,auVar107);
      uVar81 = vcmpps_avx512vl(auVar107,auVar211,1);
      bVar18 = (bool)((byte)uVar81 & 1);
      auVar123._0_4_ = (float)((uint)bVar18 * auVar106._0_4_ | (uint)!bVar18 * auVar101._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar18 * auVar106._4_4_ | (uint)!bVar18 * auVar101._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar18 * auVar106._8_4_ | (uint)!bVar18 * auVar101._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar18 * auVar106._12_4_ | (uint)!bVar18 * auVar101._12_4_);
      fVar178 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar106._16_4_);
      auVar123._16_4_ = fVar178;
      fVar190 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar106._20_4_);
      auVar123._20_4_ = fVar190;
      fVar179 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar106._24_4_);
      auVar123._24_4_ = fVar179;
      auVar123._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar106._28_4_;
      bVar18 = (bool)((byte)uVar81 & 1);
      auVar124._0_4_ = (float)((uint)bVar18 * auVar103._0_4_ | (uint)!bVar18 * auVar120._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar120._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar120._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar120._12_4_);
      bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar18 * auVar103._16_4_ | (uint)!bVar18 * auVar120._16_4_);
      bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar18 * auVar103._20_4_ | (uint)!bVar18 * auVar120._20_4_);
      bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar18 * auVar103._24_4_ | (uint)!bVar18 * auVar120._24_4_);
      bVar18 = SUB81(uVar81 >> 7,0);
      auVar124._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * auVar120._28_4_;
      auVar102 = vxorps_avx512vl(auVar102,auVar102);
      auVar107 = vfmadd213ps_avx512vl(auVar121,auVar121,ZEXT1632(auVar102));
      auVar100 = vfmadd231ps_fma(auVar107,auVar122,auVar122);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
      fVar94 = auVar107._0_4_;
      fVar177 = auVar107._4_4_;
      fVar146 = auVar107._8_4_;
      fVar147 = auVar107._12_4_;
      fVar148 = auVar107._16_4_;
      fVar149 = auVar107._20_4_;
      fVar150 = auVar107._24_4_;
      auVar40._4_4_ = fVar177 * fVar177 * fVar177 * auVar100._4_4_ * -0.5;
      auVar40._0_4_ = fVar94 * fVar94 * fVar94 * auVar100._0_4_ * -0.5;
      auVar40._8_4_ = fVar146 * fVar146 * fVar146 * auVar100._8_4_ * -0.5;
      auVar40._12_4_ = fVar147 * fVar147 * fVar147 * auVar100._12_4_ * -0.5;
      auVar40._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
      auVar40._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar40._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
      auVar40._28_4_ = 0;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar120 = vfmadd231ps_avx512vl(auVar40,auVar108,auVar107);
      auVar41._4_4_ = auVar122._4_4_ * auVar120._4_4_;
      auVar41._0_4_ = auVar122._0_4_ * auVar120._0_4_;
      auVar41._8_4_ = auVar122._8_4_ * auVar120._8_4_;
      auVar41._12_4_ = auVar122._12_4_ * auVar120._12_4_;
      auVar41._16_4_ = auVar122._16_4_ * auVar120._16_4_;
      auVar41._20_4_ = auVar122._20_4_ * auVar120._20_4_;
      auVar41._24_4_ = auVar122._24_4_ * auVar120._24_4_;
      auVar41._28_4_ = auVar107._28_4_;
      auVar42._4_4_ = auVar120._4_4_ * -auVar121._4_4_;
      auVar42._0_4_ = auVar120._0_4_ * -auVar121._0_4_;
      auVar42._8_4_ = auVar120._8_4_ * -auVar121._8_4_;
      auVar42._12_4_ = auVar120._12_4_ * -auVar121._12_4_;
      auVar42._16_4_ = auVar120._16_4_ * -fVar154;
      auVar42._20_4_ = auVar120._20_4_ * -fVar167;
      auVar42._24_4_ = auVar120._24_4_ * -fVar168;
      auVar42._28_4_ = uVar83 ^ 0x80000000;
      auVar107 = vmulps_avx512vl(auVar120,ZEXT1632(auVar102));
      auVar112 = ZEXT1632(auVar102);
      auVar119 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar112);
      auVar100 = vfmadd231ps_fma(auVar119,auVar124,auVar124);
      auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar100));
      fVar154 = auVar119._0_4_;
      fVar167 = auVar119._4_4_;
      fVar168 = auVar119._8_4_;
      fVar94 = auVar119._12_4_;
      fVar177 = auVar119._16_4_;
      fVar146 = auVar119._20_4_;
      fVar147 = auVar119._24_4_;
      auVar43._4_4_ = fVar167 * fVar167 * fVar167 * auVar100._4_4_ * -0.5;
      auVar43._0_4_ = fVar154 * fVar154 * fVar154 * auVar100._0_4_ * -0.5;
      auVar43._8_4_ = fVar168 * fVar168 * fVar168 * auVar100._8_4_ * -0.5;
      auVar43._12_4_ = fVar94 * fVar94 * fVar94 * auVar100._12_4_ * -0.5;
      auVar43._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
      auVar43._20_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar43._24_4_ = fVar147 * fVar147 * fVar147 * -0.0;
      auVar43._28_4_ = 0;
      auVar108 = vfmadd231ps_avx512vl(auVar43,auVar108,auVar119);
      auVar44._4_4_ = auVar124._4_4_ * auVar108._4_4_;
      auVar44._0_4_ = auVar124._0_4_ * auVar108._0_4_;
      auVar44._8_4_ = auVar124._8_4_ * auVar108._8_4_;
      auVar44._12_4_ = auVar124._12_4_ * auVar108._12_4_;
      auVar44._16_4_ = auVar124._16_4_ * auVar108._16_4_;
      auVar44._20_4_ = auVar124._20_4_ * auVar108._20_4_;
      auVar44._24_4_ = auVar124._24_4_ * auVar108._24_4_;
      auVar44._28_4_ = auVar119._28_4_;
      auVar45._4_4_ = -auVar123._4_4_ * auVar108._4_4_;
      auVar45._0_4_ = -auVar123._0_4_ * auVar108._0_4_;
      auVar45._8_4_ = -auVar123._8_4_ * auVar108._8_4_;
      auVar45._12_4_ = -auVar123._12_4_ * auVar108._12_4_;
      auVar45._16_4_ = -fVar178 * auVar108._16_4_;
      auVar45._20_4_ = -fVar190 * auVar108._20_4_;
      auVar45._24_4_ = -fVar179 * auVar108._24_4_;
      auVar45._28_4_ = auVar120._28_4_;
      auVar108 = vmulps_avx512vl(auVar108,auVar112);
      auVar100 = vfmadd213ps_fma(auVar41,auVar114,auVar113);
      auVar101 = vfmadd213ps_fma(auVar42,auVar114,auVar105);
      auVar120 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar118);
      auVar119 = vfmadd213ps_avx512vl(auVar44,auVar115,ZEXT1632(auVar158));
      auVar205 = vfnmadd213ps_fma(auVar41,auVar114,auVar113);
      auVar99 = vfmadd213ps_fma(auVar45,auVar115,ZEXT1632(auVar96));
      auVar180 = vfnmadd213ps_fma(auVar42,auVar114,auVar105);
      auVar98 = vfmadd213ps_fma(auVar108,auVar115,auVar111);
      auVar110 = vfnmadd231ps_avx512vl(auVar118,auVar114,auVar107);
      auVar29 = vfnmadd213ps_fma(auVar44,auVar115,ZEXT1632(auVar158));
      auVar96 = vfnmadd213ps_fma(auVar45,auVar115,ZEXT1632(auVar96));
      auVar97 = vfnmadd231ps_fma(auVar111,auVar115,auVar108);
      auVar108 = vsubps_avx512vl(auVar119,ZEXT1632(auVar205));
      auVar107 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar180));
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar98),auVar110);
      auVar118 = vmulps_avx512vl(auVar107,auVar110);
      auVar158 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar180),auVar111);
      auVar46._4_4_ = auVar205._4_4_ * auVar111._4_4_;
      auVar46._0_4_ = auVar205._0_4_ * auVar111._0_4_;
      auVar46._8_4_ = auVar205._8_4_ * auVar111._8_4_;
      auVar46._12_4_ = auVar205._12_4_ * auVar111._12_4_;
      auVar46._16_4_ = auVar111._16_4_ * 0.0;
      auVar46._20_4_ = auVar111._20_4_ * 0.0;
      auVar46._24_4_ = auVar111._24_4_ * 0.0;
      auVar46._28_4_ = auVar111._28_4_;
      auVar111 = vfmsub231ps_avx512vl(auVar46,auVar110,auVar108);
      auVar47._4_4_ = auVar180._4_4_ * auVar108._4_4_;
      auVar47._0_4_ = auVar180._0_4_ * auVar108._0_4_;
      auVar47._8_4_ = auVar180._8_4_ * auVar108._8_4_;
      auVar47._12_4_ = auVar180._12_4_ * auVar108._12_4_;
      auVar47._16_4_ = auVar108._16_4_ * 0.0;
      auVar47._20_4_ = auVar108._20_4_ * 0.0;
      auVar47._24_4_ = auVar108._24_4_ * 0.0;
      auVar47._28_4_ = auVar108._28_4_;
      auVar95 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar205),auVar107);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar112,auVar111);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,ZEXT1632(auVar158));
      auVar103 = ZEXT1632(auVar102);
      uVar81 = vcmpps_avx512vl(auVar107,auVar103,2);
      bVar80 = (byte)uVar81;
      fVar94 = (float)((uint)(bVar80 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar29._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar146 = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar29._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar148 = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar29._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar150 = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar29._12_4_);
      auVar118 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar94))));
      fVar177 = (float)((uint)(bVar80 & 1) * auVar101._0_4_ |
                       (uint)!(bool)(bVar80 & 1) * auVar96._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      fVar147 = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar96._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      fVar149 = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar96._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      fVar151 = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar96._12_4_);
      auVar112 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar177))));
      auVar125._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar97._0_4_);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar125._4_4_ = (float)((uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar97._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar125._8_4_ = (float)((uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar97._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar125._12_4_ = (float)((uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar97._12_4_);
      fVar154 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar120._16_4_);
      auVar125._16_4_ = fVar154;
      fVar167 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar120._20_4_);
      auVar125._20_4_ = fVar167;
      fVar168 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar120._24_4_);
      auVar125._24_4_ = fVar168;
      iVar1 = (uint)(byte)(uVar81 >> 7) * auVar120._28_4_;
      auVar125._28_4_ = iVar1;
      auVar108 = vblendmps_avx512vl(ZEXT1632(auVar205),auVar119);
      auVar126._0_4_ =
           (uint)(bVar80 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar101._0_4_;
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar101._4_4_;
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar101._8_4_;
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar101._12_4_;
      auVar126._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar108._16_4_;
      auVar126._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar108._20_4_;
      auVar126._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar108._24_4_;
      auVar126._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar108._28_4_;
      auVar108 = vblendmps_avx512vl(ZEXT1632(auVar180),ZEXT1632(auVar99));
      auVar127._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar158._0_4_)
      ;
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar127._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar158._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar127._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar158._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar127._12_4_ = (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar158._12_4_);
      fVar190 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar108._16_4_);
      auVar127._16_4_ = fVar190;
      fVar178 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar108._20_4_);
      auVar127._20_4_ = fVar178;
      fVar179 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar108._24_4_);
      auVar127._24_4_ = fVar179;
      auVar127._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar108._28_4_;
      auVar108 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar98));
      auVar128._0_4_ =
           (float)((uint)(bVar80 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar120._0_4_)
      ;
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar120._4_4_);
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar120._8_4_);
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar120._12_4_);
      bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar128._16_4_ = (float)((uint)bVar18 * auVar108._16_4_ | (uint)!bVar18 * auVar120._16_4_);
      bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar128._20_4_ = (float)((uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * auVar120._20_4_);
      bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar128._24_4_ = (float)((uint)bVar18 * auVar108._24_4_ | (uint)!bVar18 * auVar120._24_4_);
      bVar18 = SUB81(uVar81 >> 7,0);
      auVar128._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar120._28_4_;
      auVar129._0_4_ =
           (uint)(bVar80 & 1) * (int)auVar205._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar119._0_4_;
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar18 * (int)auVar205._4_4_ | (uint)!bVar18 * auVar119._4_4_;
      bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar18 * (int)auVar205._8_4_ | (uint)!bVar18 * auVar119._8_4_;
      bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar18 * (int)auVar205._12_4_ | (uint)!bVar18 * auVar119._12_4_;
      auVar129._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar119._16_4_;
      auVar129._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar119._20_4_;
      auVar129._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar119._24_4_;
      auVar129._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar119._28_4_;
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar130._0_4_ =
           (uint)(bVar80 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar98._0_4_;
      bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar19 * auVar110._4_4_ | (uint)!bVar19 * auVar98._4_4_;
      bVar19 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar19 * auVar110._8_4_ | (uint)!bVar19 * auVar98._8_4_;
      bVar19 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar19 * auVar110._12_4_ | (uint)!bVar19 * auVar98._12_4_;
      auVar130._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar110._16_4_;
      auVar130._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar110._20_4_;
      auVar130._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar110._24_4_;
      iVar2 = (uint)(byte)(uVar81 >> 7) * auVar110._28_4_;
      auVar130._28_4_ = iVar2;
      auVar113 = vsubps_avx512vl(auVar129,auVar118);
      auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar180._12_4_ |
                                               (uint)!bVar21 * auVar99._12_4_,
                                               CONCAT48((uint)bVar20 * (int)auVar180._8_4_ |
                                                        (uint)!bVar20 * auVar99._8_4_,
                                                        CONCAT44((uint)bVar18 * (int)auVar180._4_4_
                                                                 | (uint)!bVar18 * auVar99._4_4_,
                                                                 (uint)(bVar80 & 1) *
                                                                 (int)auVar180._0_4_ |
                                                                 (uint)!(bool)(bVar80 & 1) *
                                                                 auVar99._0_4_)))),auVar112);
      auVar201 = ZEXT3264(auVar108);
      auVar120 = vsubps_avx(auVar130,auVar125);
      auVar119 = vsubps_avx(auVar118,auVar126);
      auVar204 = ZEXT3264(auVar119);
      auVar110 = vsubps_avx(auVar112,auVar127);
      auVar111 = vsubps_avx(auVar125,auVar128);
      auVar48._4_4_ = auVar120._4_4_ * fVar146;
      auVar48._0_4_ = auVar120._0_4_ * fVar94;
      auVar48._8_4_ = auVar120._8_4_ * fVar148;
      auVar48._12_4_ = auVar120._12_4_ * fVar150;
      auVar48._16_4_ = auVar120._16_4_ * 0.0;
      auVar48._20_4_ = auVar120._20_4_ * 0.0;
      auVar48._24_4_ = auVar120._24_4_ * 0.0;
      auVar48._28_4_ = iVar2;
      auVar100 = vfmsub231ps_fma(auVar48,auVar125,auVar113);
      auVar49._4_4_ = fVar147 * auVar113._4_4_;
      auVar49._0_4_ = fVar177 * auVar113._0_4_;
      auVar49._8_4_ = fVar149 * auVar113._8_4_;
      auVar49._12_4_ = fVar151 * auVar113._12_4_;
      auVar49._16_4_ = auVar113._16_4_ * 0.0;
      auVar49._20_4_ = auVar113._20_4_ * 0.0;
      auVar49._24_4_ = auVar113._24_4_ * 0.0;
      auVar49._28_4_ = auVar107._28_4_;
      auVar101 = vfmsub231ps_fma(auVar49,auVar118,auVar108);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar103,ZEXT1632(auVar100));
      auVar192._0_4_ = auVar108._0_4_ * auVar125._0_4_;
      auVar192._4_4_ = auVar108._4_4_ * auVar125._4_4_;
      auVar192._8_4_ = auVar108._8_4_ * auVar125._8_4_;
      auVar192._12_4_ = auVar108._12_4_ * auVar125._12_4_;
      auVar192._16_4_ = auVar108._16_4_ * fVar154;
      auVar192._20_4_ = auVar108._20_4_ * fVar167;
      auVar192._24_4_ = auVar108._24_4_ * fVar168;
      auVar192._28_4_ = 0;
      auVar100 = vfmsub231ps_fma(auVar192,auVar112,auVar120);
      auVar105 = vfmadd231ps_avx512vl(auVar107,auVar103,ZEXT1632(auVar100));
      auVar107 = vmulps_avx512vl(auVar111,auVar126);
      auVar107 = vfmsub231ps_avx512vl(auVar107,auVar119,auVar128);
      auVar50._4_4_ = auVar110._4_4_ * auVar128._4_4_;
      auVar50._0_4_ = auVar110._0_4_ * auVar128._0_4_;
      auVar50._8_4_ = auVar110._8_4_ * auVar128._8_4_;
      auVar50._12_4_ = auVar110._12_4_ * auVar128._12_4_;
      auVar50._16_4_ = auVar110._16_4_ * auVar128._16_4_;
      auVar50._20_4_ = auVar110._20_4_ * auVar128._20_4_;
      auVar50._24_4_ = auVar110._24_4_ * auVar128._24_4_;
      auVar50._28_4_ = auVar128._28_4_;
      auVar100 = vfmsub231ps_fma(auVar50,auVar127,auVar111);
      auVar193._0_4_ = auVar127._0_4_ * auVar119._0_4_;
      auVar193._4_4_ = auVar127._4_4_ * auVar119._4_4_;
      auVar193._8_4_ = auVar127._8_4_ * auVar119._8_4_;
      auVar193._12_4_ = auVar127._12_4_ * auVar119._12_4_;
      auVar193._16_4_ = fVar190 * auVar119._16_4_;
      auVar193._20_4_ = fVar178 * auVar119._20_4_;
      auVar193._24_4_ = fVar179 * auVar119._24_4_;
      auVar193._28_4_ = 0;
      auVar101 = vfmsub231ps_fma(auVar193,auVar110,auVar126);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar103,auVar107);
      auVar106 = vfmadd231ps_avx512vl(auVar107,auVar103,ZEXT1632(auVar100));
      auVar196 = ZEXT3264(auVar106);
      auVar107 = vmaxps_avx(auVar105,auVar106);
      uVar25 = vcmpps_avx512vl(auVar107,auVar103,2);
      bVar92 = bVar92 & (byte)uVar25;
      if (bVar92 != 0) {
        auVar51._4_4_ = auVar111._4_4_ * auVar108._4_4_;
        auVar51._0_4_ = auVar111._0_4_ * auVar108._0_4_;
        auVar51._8_4_ = auVar111._8_4_ * auVar108._8_4_;
        auVar51._12_4_ = auVar111._12_4_ * auVar108._12_4_;
        auVar51._16_4_ = auVar111._16_4_ * auVar108._16_4_;
        auVar51._20_4_ = auVar111._20_4_ * auVar108._20_4_;
        auVar51._24_4_ = auVar111._24_4_ * auVar108._24_4_;
        auVar51._28_4_ = auVar107._28_4_;
        auVar158 = vfmsub231ps_fma(auVar51,auVar110,auVar120);
        auVar52._4_4_ = auVar120._4_4_ * auVar119._4_4_;
        auVar52._0_4_ = auVar120._0_4_ * auVar119._0_4_;
        auVar52._8_4_ = auVar120._8_4_ * auVar119._8_4_;
        auVar52._12_4_ = auVar120._12_4_ * auVar119._12_4_;
        auVar52._16_4_ = auVar120._16_4_ * auVar119._16_4_;
        auVar52._20_4_ = auVar120._20_4_ * auVar119._20_4_;
        auVar52._24_4_ = auVar120._24_4_ * auVar119._24_4_;
        auVar52._28_4_ = auVar120._28_4_;
        auVar99 = vfmsub231ps_fma(auVar52,auVar113,auVar111);
        auVar53._4_4_ = auVar110._4_4_ * auVar113._4_4_;
        auVar53._0_4_ = auVar110._0_4_ * auVar113._0_4_;
        auVar53._8_4_ = auVar110._8_4_ * auVar113._8_4_;
        auVar53._12_4_ = auVar110._12_4_ * auVar113._12_4_;
        auVar53._16_4_ = auVar110._16_4_ * auVar113._16_4_;
        auVar53._20_4_ = auVar110._20_4_ * auVar113._20_4_;
        auVar53._24_4_ = auVar110._24_4_ * auVar113._24_4_;
        auVar53._28_4_ = auVar110._28_4_;
        auVar98 = vfmsub231ps_fma(auVar53,auVar119,auVar108);
        auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar98));
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar158),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar107 = vrcp14ps_avx512vl(ZEXT1632(auVar101));
        auVar204 = ZEXT3264(auVar107);
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar30._16_4_ = 0x3f800000;
        auVar30._20_4_ = 0x3f800000;
        auVar30._24_4_ = 0x3f800000;
        auVar30._28_4_ = 0x3f800000;
        auVar108 = vfnmadd213ps_avx512vl(auVar107,ZEXT1632(auVar101),auVar30);
        auVar100 = vfmadd132ps_fma(auVar108,auVar107,auVar107);
        auVar201 = ZEXT1664(auVar100);
        auVar54._4_4_ = auVar98._4_4_ * auVar125._4_4_;
        auVar54._0_4_ = auVar98._0_4_ * auVar125._0_4_;
        auVar54._8_4_ = auVar98._8_4_ * auVar125._8_4_;
        auVar54._12_4_ = auVar98._12_4_ * auVar125._12_4_;
        auVar54._16_4_ = fVar154 * 0.0;
        auVar54._20_4_ = fVar167 * 0.0;
        auVar54._24_4_ = fVar168 * 0.0;
        auVar54._28_4_ = iVar1;
        auVar99 = vfmadd231ps_fma(auVar54,auVar112,ZEXT1632(auVar99));
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar118,ZEXT1632(auVar158));
        fVar154 = auVar100._0_4_;
        fVar167 = auVar100._4_4_;
        fVar168 = auVar100._8_4_;
        fVar179 = auVar100._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar179,
                                       CONCAT48(auVar99._8_4_ * fVar168,
                                                CONCAT44(auVar99._4_4_ * fVar167,
                                                         auVar99._0_4_ * fVar154))));
        auVar206 = ZEXT3264(local_240);
        auVar159._4_4_ = local_440;
        auVar159._0_4_ = local_440;
        auVar159._8_4_ = local_440;
        auVar159._12_4_ = local_440;
        auVar159._16_4_ = local_440;
        auVar159._20_4_ = local_440;
        auVar159._24_4_ = local_440;
        auVar159._28_4_ = local_440;
        uVar25 = vcmpps_avx512vl(auVar159,local_240,2);
        uVar155 = *(undefined4 *)(ray + sVar91 * 4 + 0x80);
        auVar31._4_4_ = uVar155;
        auVar31._0_4_ = uVar155;
        auVar31._8_4_ = uVar155;
        auVar31._12_4_ = uVar155;
        auVar31._16_4_ = uVar155;
        auVar31._20_4_ = uVar155;
        auVar31._24_4_ = uVar155;
        auVar31._28_4_ = uVar155;
        uVar26 = vcmpps_avx512vl(local_240,auVar31,2);
        bVar92 = (byte)uVar25 & (byte)uVar26 & bVar92;
        if (bVar92 != 0) {
          uVar89 = vcmpps_avx512vl(ZEXT1632(auVar101),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar89 = bVar92 & uVar89;
          if ((char)uVar89 != '\0') {
            fVar178 = auVar105._0_4_ * fVar154;
            fVar190 = auVar105._4_4_ * fVar167;
            auVar55._4_4_ = fVar190;
            auVar55._0_4_ = fVar178;
            fVar94 = auVar105._8_4_ * fVar168;
            auVar55._8_4_ = fVar94;
            fVar177 = auVar105._12_4_ * fVar179;
            auVar55._12_4_ = fVar177;
            fVar146 = auVar105._16_4_ * 0.0;
            auVar55._16_4_ = fVar146;
            fVar147 = auVar105._20_4_ * 0.0;
            auVar55._20_4_ = fVar147;
            fVar148 = auVar105._24_4_ * 0.0;
            auVar55._24_4_ = fVar148;
            auVar55._28_4_ = auVar105._28_4_;
            auVar160._8_4_ = 0x3f800000;
            auVar160._0_8_ = 0x3f8000003f800000;
            auVar160._12_4_ = 0x3f800000;
            auVar160._16_4_ = 0x3f800000;
            auVar160._20_4_ = 0x3f800000;
            auVar160._24_4_ = 0x3f800000;
            auVar160._28_4_ = 0x3f800000;
            auVar107 = vsubps_avx(auVar160,auVar55);
            local_280._0_4_ =
                 (float)((uint)(bVar80 & 1) * (int)fVar178 |
                        (uint)!(bool)(bVar80 & 1) * auVar107._0_4_);
            bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar18 * (int)fVar190 | (uint)!bVar18 * auVar107._4_4_);
            bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar18 * (int)fVar94 | (uint)!bVar18 * auVar107._8_4_);
            bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
            local_280._12_4_ =
                 (float)((uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar107._12_4_);
            bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar107._16_4_);
            bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar107._20_4_);
            bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar107._24_4_);
            bVar18 = SUB81(uVar81 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar18 * auVar105._28_4_ | (uint)!bVar18 * auVar107._28_4_);
            auVar107 = vsubps_avx(auVar115,auVar114);
            auVar100 = vfmadd213ps_fma(auVar107,local_280,auVar114);
            uVar155 = *(undefined4 *)((long)pPVar86->ray_space + sVar91 * 4 + -0x10);
            auVar32._4_4_ = uVar155;
            auVar32._0_4_ = uVar155;
            auVar32._8_4_ = uVar155;
            auVar32._12_4_ = uVar155;
            auVar32._16_4_ = uVar155;
            auVar32._20_4_ = uVar155;
            auVar32._24_4_ = uVar155;
            auVar32._28_4_ = uVar155;
            auVar107 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                          CONCAT48(auVar100._8_4_ + auVar100._8_4_,
                                                                   CONCAT44(auVar100._4_4_ +
                                                                            auVar100._4_4_,
                                                                            auVar100._0_4_ +
                                                                            auVar100._0_4_)))),
                                       auVar32);
            uVar93 = vcmpps_avx512vl(local_240,auVar107,6);
            uVar89 = uVar89 & uVar93;
            bVar92 = (byte)uVar89;
            if (bVar92 != 0) {
              auVar175._0_4_ = auVar106._0_4_ * fVar154;
              auVar175._4_4_ = auVar106._4_4_ * fVar167;
              auVar175._8_4_ = auVar106._8_4_ * fVar168;
              auVar175._12_4_ = auVar106._12_4_ * fVar179;
              auVar175._16_4_ = auVar106._16_4_ * 0.0;
              auVar175._20_4_ = auVar106._20_4_ * 0.0;
              auVar175._24_4_ = auVar106._24_4_ * 0.0;
              auVar175._28_4_ = 0;
              auVar187._8_4_ = 0x3f800000;
              auVar187._0_8_ = 0x3f8000003f800000;
              auVar187._12_4_ = 0x3f800000;
              auVar187._16_4_ = 0x3f800000;
              auVar187._20_4_ = 0x3f800000;
              auVar187._24_4_ = 0x3f800000;
              auVar187._28_4_ = 0x3f800000;
              auVar107 = vsubps_avx(auVar187,auVar175);
              auVar131._0_4_ =
                   (uint)(bVar80 & 1) * (int)auVar175._0_4_ |
                   (uint)!(bool)(bVar80 & 1) * auVar107._0_4_;
              bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
              auVar131._4_4_ = (uint)bVar18 * (int)auVar175._4_4_ | (uint)!bVar18 * auVar107._4_4_;
              bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
              auVar131._8_4_ = (uint)bVar18 * (int)auVar175._8_4_ | (uint)!bVar18 * auVar107._8_4_;
              bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
              auVar131._12_4_ =
                   (uint)bVar18 * (int)auVar175._12_4_ | (uint)!bVar18 * auVar107._12_4_;
              bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
              auVar131._16_4_ =
                   (uint)bVar18 * (int)auVar175._16_4_ | (uint)!bVar18 * auVar107._16_4_;
              bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
              auVar131._20_4_ =
                   (uint)bVar18 * (int)auVar175._20_4_ | (uint)!bVar18 * auVar107._20_4_;
              bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
              auVar131._24_4_ =
                   (uint)bVar18 * (int)auVar175._24_4_ | (uint)!bVar18 * auVar107._24_4_;
              auVar131._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar107._28_4_;
              auVar33._8_4_ = 0x40000000;
              auVar33._0_8_ = 0x4000000040000000;
              auVar33._12_4_ = 0x40000000;
              auVar33._16_4_ = 0x40000000;
              auVar33._20_4_ = 0x40000000;
              auVar33._24_4_ = 0x40000000;
              auVar33._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar131,auVar187,auVar33);
              local_220 = 0;
              local_21c = iVar15;
              auVar204 = ZEXT1664(local_5a0);
              local_210 = local_5a0;
              local_200 = uVar24;
              uStack_1f8 = uVar27;
              local_1f0 = uVar74;
              uStack_1e8 = uVar75;
              local_1e0 = uVar76;
              uStack_1d8 = uVar77;
              if ((pGVar87->mask & *(uint *)(ray + sVar91 * 4 + 0x90)) != 0) {
                fVar170 = 1.0 / auVar210._0_4_;
                local_1c0[0] = fVar170 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar170 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar170 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar170 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar170 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar170 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar170 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar161._8_4_ = 0x7f800000;
                auVar161._0_8_ = 0x7f8000007f800000;
                auVar161._12_4_ = 0x7f800000;
                auVar161._16_4_ = 0x7f800000;
                auVar161._20_4_ = 0x7f800000;
                auVar161._24_4_ = 0x7f800000;
                auVar161._28_4_ = 0x7f800000;
                auVar107 = vblendmps_avx512vl(auVar161,local_240);
                auVar132._0_4_ =
                     (uint)(bVar92 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
                auVar132._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                auVar132._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
                auVar132._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
                auVar132._16_4_ = (uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
                auVar132._20_4_ = (uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
                auVar132._24_4_ = (uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * 0x7f800000;
                bVar18 = SUB81(uVar89 >> 7,0);
                auVar132._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * 0x7f800000;
                auVar107 = vshufps_avx(auVar132,auVar132,0xb1);
                auVar107 = vminps_avx(auVar132,auVar107);
                auVar108 = vshufpd_avx(auVar107,auVar107,5);
                auVar107 = vminps_avx(auVar107,auVar108);
                auVar108 = vpermpd_avx2(auVar107,0x4e);
                auVar107 = vminps_avx(auVar107,auVar108);
                uVar25 = vcmpps_avx512vl(auVar132,auVar107,0);
                uVar83 = (uint)uVar89;
                if ((bVar92 & (byte)uVar25) != 0) {
                  uVar83 = (uint)(bVar92 & (byte)uVar25);
                }
                uVar28 = 0;
                for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                  uVar28 = uVar28 + 1;
                }
                uVar81 = (ulong)uVar28;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_460 = *(float *)(ray + sVar91 * 4 + 0x80);
                  fStack_45c = 0.0;
                  fStack_458 = 0.0;
                  fStack_454 = 0.0;
                  local_540 = auVar109;
                  local_520 = local_240;
                  do {
                    local_3e0 = local_1c0[uVar81];
                    local_3d0 = *(undefined4 *)(local_1a0 + uVar81 * 4);
                    *(undefined4 *)(ray + sVar91 * 4 + 0x80) =
                         *(undefined4 *)(local_180 + uVar81 * 4);
                    local_590.context = context->user;
                    fVar154 = 1.0 - local_3e0;
                    fVar170 = fVar154 * fVar154 * -3.0;
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                               ZEXT416((uint)(local_3e0 * fVar154)),
                                               ZEXT416(0xc0000000));
                    auVar101 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar154)),
                                               ZEXT416((uint)(local_3e0 * local_3e0)),
                                               ZEXT416(0x40000000));
                    fVar154 = auVar100._0_4_ * 3.0;
                    fVar167 = auVar101._0_4_ * 3.0;
                    fVar168 = local_3e0 * local_3e0 * 3.0;
                    auVar200._0_4_ = fVar168 * local_600;
                    auVar200._4_4_ = fVar168 * fStack_5fc;
                    auVar200._8_4_ = fVar168 * fStack_5f8;
                    auVar200._12_4_ = fVar168 * fStack_5f4;
                    auVar201 = ZEXT1664(auVar200);
                    auVar158._4_4_ = fVar167;
                    auVar158._0_4_ = fVar167;
                    auVar158._8_4_ = fVar167;
                    auVar158._12_4_ = fVar167;
                    auVar100 = vfmadd132ps_fma(auVar158,auVar200,auVar8);
                    auVar185._4_4_ = fVar154;
                    auVar185._0_4_ = fVar154;
                    auVar185._8_4_ = fVar154;
                    auVar185._12_4_ = fVar154;
                    auVar100 = vfmadd132ps_fma(auVar185,auVar100,auVar9);
                    auVar98._4_4_ = fVar170;
                    auVar98._0_4_ = fVar170;
                    auVar98._8_4_ = fVar170;
                    auVar98._12_4_ = fVar170;
                    auVar100 = vfmadd213ps_fma(auVar98,auVar204._0_16_,auVar100);
                    local_410 = auVar100._0_4_;
                    local_400 = vshufps_avx(auVar100,auVar100,0x55);
                    auVar196 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar100,auVar100,0xaa);
                    iStack_40c = local_410;
                    iStack_408 = local_410;
                    iStack_404 = local_410;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = local_4c0._0_8_;
                    uStack_3b8 = local_4c0._8_8_;
                    local_3b0 = local_4b0;
                    vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                    uStack_39c = (local_590.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_590.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_5d0 = local_4d0;
                    local_590.valid = (int *)local_5d0;
                    local_590.geometryUserPtr = pGVar87->userPtr;
                    local_590.hit = (RTCHitN *)&local_410;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar196 = ZEXT1664(local_400);
                      auVar201 = ZEXT1664(auVar200);
                      (*pGVar87->intersectionFilterN)(&local_590);
                      auVar206 = ZEXT3264(local_520);
                      auVar219 = ZEXT3264(local_540);
                      auVar220 = ZEXT3264(local_4a0);
                      auVar218 = ZEXT3264(local_480);
                      auVar204 = ZEXT1664(local_5a0);
                      sVar91 = local_550;
                    }
                    uVar93 = vptestmd_avx512vl(local_5d0,local_5d0);
                    if ((uVar93 & 0xf) == 0) {
LAB_01a895c9:
                      *(float *)(ray + sVar91 * 4 + 0x80) = local_460;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar87->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar196 = ZEXT1664(auVar196._0_16_);
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        (*p_Var17)(&local_590);
                        auVar206 = ZEXT3264(local_520);
                        auVar219 = ZEXT3264(local_540);
                        auVar220 = ZEXT3264(local_4a0);
                        auVar218 = ZEXT3264(local_480);
                        auVar204 = ZEXT1664(local_5a0);
                        sVar91 = local_550;
                      }
                      uVar93 = vptestmd_avx512vl(local_5d0,local_5d0);
                      uVar93 = uVar93 & 0xf;
                      bVar92 = (byte)uVar93;
                      if (bVar92 == 0) goto LAB_01a895c9;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar73 = *(int *)(local_590.hit + 0xc);
                      bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar20 = SUB81(uVar93 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar92 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar73 = *(int *)(local_590.hit + 0x1c);
                      bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar20 = SUB81(uVar93 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar73 = *(int *)(local_590.hit + 0x2c);
                      bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar20 = SUB81(uVar93 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar73 = *(int *)(local_590.hit + 0x3c);
                      bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar20 = SUB81(uVar93 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar73 = *(int *)(local_590.hit + 0x4c);
                      bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                      bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                      bVar20 = SUB81(uVar93 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar20 * iVar73 | (uint)!bVar20 * *(int *)(local_590.ray + 0x10c);
                      auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar100;
                      auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar100;
                      auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar100;
                      auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar100;
                      local_460 = *(float *)(ray + sVar91 * 4 + 0x80);
                      fStack_45c = 0.0;
                      fStack_458 = 0.0;
                      fStack_454 = 0.0;
                    }
                    auVar109 = auVar219._0_32_;
                    bVar92 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar89;
                    auVar165._4_4_ = local_460;
                    auVar165._0_4_ = local_460;
                    auVar165._8_4_ = local_460;
                    auVar165._12_4_ = local_460;
                    auVar165._16_4_ = local_460;
                    auVar165._20_4_ = local_460;
                    auVar165._24_4_ = local_460;
                    auVar165._28_4_ = local_460;
                    uVar25 = vcmpps_avx512vl(auVar206._0_32_,auVar165,2);
                    if ((bVar92 & (byte)uVar25) == 0) goto LAB_01a8855d;
                    bVar92 = bVar92 & (byte)uVar25;
                    uVar89 = (ulong)bVar92;
                    auVar166._8_4_ = 0x7f800000;
                    auVar166._0_8_ = 0x7f8000007f800000;
                    auVar166._12_4_ = 0x7f800000;
                    auVar166._16_4_ = 0x7f800000;
                    auVar166._20_4_ = 0x7f800000;
                    auVar166._24_4_ = 0x7f800000;
                    auVar166._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar166,auVar206._0_32_);
                    auVar145._0_4_ =
                         (uint)(bVar92 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 1 & 1);
                    auVar145._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 2 & 1);
                    auVar145._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 3 & 1);
                    auVar145._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 4 & 1);
                    auVar145._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 5 & 1);
                    auVar145._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)(bVar92 >> 6 & 1);
                    auVar145._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar145._28_4_ =
                         (uint)(bVar92 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar145,auVar145,0xb1);
                    auVar109 = vminps_avx(auVar145,auVar109);
                    auVar107 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    auVar107 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    uVar25 = vcmpps_avx512vl(auVar145,auVar109,0);
                    bVar80 = (byte)uVar25 & bVar92;
                    if (bVar80 != 0) {
                      bVar92 = bVar80;
                    }
                    uVar82 = 0;
                    for (uVar83 = (uint)bVar92; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000
                        ) {
                      uVar82 = uVar82 + 1;
                    }
                    uVar81 = (ulong)uVar82;
                  } while( true );
                }
                fVar170 = local_1c0[uVar81];
                uVar155 = *(undefined4 *)(local_1a0 + uVar81 * 4);
                fVar167 = 1.0 - fVar170;
                fVar154 = fVar167 * fVar167 * -3.0;
                auVar196 = ZEXT464((uint)fVar154);
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),
                                           ZEXT416((uint)(fVar170 * fVar167)),ZEXT416(0xc0000000));
                auVar101 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar167)),
                                           ZEXT416((uint)(fVar170 * fVar170)),ZEXT416(0x40000000));
                fVar167 = auVar100._0_4_ * 3.0;
                fVar168 = auVar101._0_4_ * 3.0;
                fVar179 = fVar170 * fVar170 * 3.0;
                auVar197._0_4_ = fVar179 * local_600;
                auVar197._4_4_ = fVar179 * fStack_5fc;
                auVar197._8_4_ = fVar179 * fStack_5f8;
                auVar197._12_4_ = fVar179 * fStack_5f4;
                auVar201 = ZEXT1664(auVar197);
                auVar171._4_4_ = fVar168;
                auVar171._0_4_ = fVar168;
                auVar171._8_4_ = fVar168;
                auVar171._12_4_ = fVar168;
                auVar100 = vfmadd132ps_fma(auVar171,auVar197,*pauVar4);
                auVar182._4_4_ = fVar167;
                auVar182._0_4_ = fVar167;
                auVar182._8_4_ = fVar167;
                auVar182._12_4_ = fVar167;
                auVar100 = vfmadd132ps_fma(auVar182,auVar100,*pauVar3);
                auVar172._4_4_ = fVar154;
                auVar172._0_4_ = fVar154;
                auVar172._8_4_ = fVar154;
                auVar172._12_4_ = fVar154;
                auVar100 = vfmadd213ps_fma(auVar172,local_5a0,auVar100);
                *(undefined4 *)(ray + sVar91 * 4 + 0x80) = *(undefined4 *)(local_180 + uVar81 * 4);
                *(int *)(ray + sVar91 * 4 + 0xc0) = auVar100._0_4_;
                uVar16 = vextractps_avx(auVar100,1);
                *(undefined4 *)(ray + sVar91 * 4 + 0xd0) = uVar16;
                uVar16 = vextractps_avx(auVar100,2);
                *(undefined4 *)(ray + sVar91 * 4 + 0xe0) = uVar16;
                *(float *)(ray + sVar91 * 4 + 0xf0) = fVar170;
                *(undefined4 *)(ray + sVar91 * 4 + 0x100) = uVar155;
                *(uint *)(ray + sVar91 * 4 + 0x110) = uVar82;
                *(uint *)(ray + sVar91 * 4 + 0x120) = uVar14;
                *(uint *)(ray + sVar91 * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + sVar91 * 4 + 0x140) = context->user->instPrimID[0];
LAB_01a8855d:
                pPVar86 = local_5b8;
                prim = local_5b0;
                fVar170 = (float)local_560._0_4_;
              }
            }
          }
        }
      }
    }
    local_560._0_4_ = fVar170;
    if (8 < iVar15) {
      auVar107 = vpbroadcastd_avx512vl();
      auVar219 = ZEXT3264(auVar107);
      local_460 = (float)local_560._0_4_;
      fStack_45c = (float)local_560._0_4_;
      fStack_458 = (float)local_560._0_4_;
      fStack_454 = (float)local_560._0_4_;
      fStack_450 = (float)local_560._0_4_;
      fStack_44c = (float)local_560._0_4_;
      fStack_448 = (float)local_560._0_4_;
      fStack_444 = (float)local_560._0_4_;
      uStack_43c = local_440;
      uStack_438 = local_440;
      uStack_434 = local_440;
      uStack_430 = local_440;
      uStack_42c = local_440;
      uStack_428 = local_440;
      uStack_424 = local_440;
      local_120 = 1.0 / (float)local_500._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar85 = 8;
      local_540 = auVar109;
LAB_01a885f8:
      if (lVar85 < lVar84) {
        auVar109 = vpbroadcastd_avx512vl();
        auVar109 = vpor_avx2(auVar109,_DAT_01fb4ba0);
        uVar26 = vpcmpgtd_avx512vl(auVar219._0_32_,auVar109);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar85 * 4 + lVar90);
        auVar107 = *(undefined1 (*) [32])(lVar90 + 0x21fb768 + lVar85 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar90 + 0x21fbbec + lVar85 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar90 + 0x21fc070 + lVar85 * 4);
        auVar206._0_4_ = auVar120._0_4_ * (float)local_360._0_4_;
        auVar206._4_4_ = auVar120._4_4_ * (float)local_360._4_4_;
        auVar206._8_4_ = auVar120._8_4_ * fStack_358;
        auVar206._12_4_ = auVar120._12_4_ * fStack_354;
        auVar206._16_4_ = auVar120._16_4_ * fStack_350;
        auVar206._20_4_ = auVar120._20_4_ * fStack_34c;
        auVar206._28_36_ = auVar201._28_36_;
        auVar206._24_4_ = auVar120._24_4_ * fStack_348;
        auVar201._0_4_ = auVar120._0_4_ * (float)local_380._0_4_;
        auVar201._4_4_ = auVar120._4_4_ * (float)local_380._4_4_;
        auVar201._8_4_ = auVar120._8_4_ * fStack_378;
        auVar201._12_4_ = auVar120._12_4_ * fStack_374;
        auVar201._16_4_ = auVar120._16_4_ * fStack_370;
        auVar201._20_4_ = auVar120._20_4_ * fStack_36c;
        auVar201._28_36_ = auVar196._28_36_;
        auVar201._24_4_ = auVar120._24_4_ * fStack_368;
        auVar119 = vmulps_avx512vl(local_100,auVar120);
        local_480 = auVar218._0_32_;
        auVar110 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar108,local_320);
        auVar111 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar108,local_340);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar108,local_e0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,local_2e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,local_300);
        auVar118 = vfmadd231ps_avx512vl(auVar119,auVar107,local_c0);
        auVar100 = vfmadd231ps_fma(auVar110,auVar109,local_2a0);
        auVar201 = ZEXT1664(auVar100);
        auVar101 = vfmadd231ps_fma(auVar111,auVar109,local_2c0);
        auVar196 = ZEXT1664(auVar101);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar85 * 4 + lVar90);
        auVar110 = *(undefined1 (*) [32])(lVar90 + 0x21fdb88 + lVar85 * 4);
        auVar105 = vfmadd231ps_avx512vl(auVar118,auVar109,local_a0);
        auVar111 = *(undefined1 (*) [32])(lVar90 + 0x21fe00c + lVar85 * 4);
        auVar118 = *(undefined1 (*) [32])(lVar90 + 0x21fe490 + lVar85 * 4);
        auVar218._0_4_ = auVar118._0_4_ * (float)local_360._0_4_;
        auVar218._4_4_ = auVar118._4_4_ * (float)local_360._4_4_;
        auVar218._8_4_ = auVar118._8_4_ * fStack_358;
        auVar218._12_4_ = auVar118._12_4_ * fStack_354;
        auVar218._16_4_ = auVar118._16_4_ * fStack_350;
        auVar218._20_4_ = auVar118._20_4_ * fStack_34c;
        auVar218._28_36_ = auVar204._28_36_;
        auVar218._24_4_ = auVar118._24_4_ * fStack_348;
        auVar56._4_4_ = auVar118._4_4_ * (float)local_380._4_4_;
        auVar56._0_4_ = auVar118._0_4_ * (float)local_380._0_4_;
        auVar56._8_4_ = auVar118._8_4_ * fStack_378;
        auVar56._12_4_ = auVar118._12_4_ * fStack_374;
        auVar56._16_4_ = auVar118._16_4_ * fStack_370;
        auVar56._20_4_ = auVar118._20_4_ * fStack_36c;
        auVar56._24_4_ = auVar118._24_4_ * fStack_368;
        auVar56._28_4_ = uStack_364;
        auVar112 = vmulps_avx512vl(local_100,auVar118);
        auVar113 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar111,local_320);
        auVar218 = ZEXT3264(local_480);
        auVar106 = vfmadd231ps_avx512vl(auVar56,auVar111,local_340);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,local_e0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,local_2e0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,local_300);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_c0);
        auVar8 = vfmadd231ps_fma(auVar113,auVar119,local_2a0);
        auVar204 = ZEXT1664(auVar8);
        auVar9 = vfmadd231ps_fma(auVar106,auVar119,local_2c0);
        auVar106 = vfmadd231ps_avx512vl(auVar112,auVar119,local_a0);
        auVar103 = vmaxps_avx512vl(auVar105,auVar106);
        auVar112 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar100));
        auVar113 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar101));
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar101),auVar112);
        auVar114 = vmulps_avx512vl(ZEXT1632(auVar100),auVar113);
        auVar104 = vsubps_avx512vl(auVar104,auVar114);
        auVar114 = vmulps_avx512vl(auVar113,auVar113);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar112,auVar112);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar114);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar25 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar92 = (byte)uVar26 & (byte)uVar25;
        if (bVar92 != 0) {
          auVar118 = vmulps_avx512vl(local_160,auVar118);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_540,auVar118);
          local_4a0 = auVar220._0_32_;
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_4a0,auVar111);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_480,auVar110);
          auVar120 = vmulps_avx512vl(local_160,auVar120);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_540,auVar120);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_4a0,auVar108);
          auVar110 = vfmadd213ps_avx512vl(auVar109,local_480,auVar107);
          auVar109 = *(undefined1 (*) [32])(lVar90 + 0x21fc4f4 + lVar85 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x21fc978 + lVar85 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar90 + 0x21fcdfc + lVar85 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar90 + 0x21fd280 + lVar85 * 4);
          auVar111 = vmulps_avx512vl(_local_360,auVar120);
          auVar118 = vmulps_avx512vl(_local_380,auVar120);
          auVar120 = vmulps_avx512vl(local_160,auVar120);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_320);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar108,local_340);
          auVar99 = vfmadd231ps_fma(auVar120,auVar108,local_540);
          auVar108 = vfmadd231ps_avx512vl(auVar111,auVar107,local_2e0);
          auVar120 = vfmadd231ps_avx512vl(auVar118,auVar107,local_300);
          auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),local_4a0,auVar107);
          auVar111 = vfmadd231ps_avx512vl(auVar108,auVar109,local_2a0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar109,local_2c0);
          auVar118 = vfmadd231ps_avx512vl(auVar107,local_480,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar90 + 0x21fe914 + lVar85 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x21ff21c + lVar85 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar90 + 0x21ff6a0 + lVar85 * 4);
          auVar103 = vmulps_avx512vl(_local_360,auVar108);
          auVar104 = vmulps_avx512vl(_local_380,auVar108);
          auVar108 = vmulps_avx512vl(local_160,auVar108);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_320);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_340);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_540,auVar107);
          auVar107 = *(undefined1 (*) [32])(lVar90 + 0x21fed98 + lVar85 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,local_2e0);
          auVar218 = ZEXT3264(local_480);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_300);
          auVar107 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar107);
          auVar108 = vfmadd231ps_avx512vl(auVar103,auVar109,local_2a0);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar109,local_2c0);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_480,auVar109);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar111,auVar104);
          vandps_avx512vl(auVar120,auVar104);
          auVar109 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar118,auVar104);
          auVar109 = vmaxps_avx(auVar109,auVar104);
          auVar78._4_4_ = fStack_45c;
          auVar78._0_4_ = local_460;
          auVar78._8_4_ = fStack_458;
          auVar78._12_4_ = fStack_454;
          auVar78._16_4_ = fStack_450;
          auVar78._20_4_ = fStack_44c;
          auVar78._24_4_ = fStack_448;
          auVar78._28_4_ = fStack_444;
          uVar81 = vcmpps_avx512vl(auVar109,auVar78,1);
          bVar18 = (bool)((byte)uVar81 & 1);
          auVar133._0_4_ = (float)((uint)bVar18 * auVar112._0_4_ | (uint)!bVar18 * auVar111._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar18 * auVar112._4_4_ | (uint)!bVar18 * auVar111._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar18 * auVar112._8_4_ | (uint)!bVar18 * auVar111._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar133._12_4_ =
               (float)((uint)bVar18 * auVar112._12_4_ | (uint)!bVar18 * auVar111._12_4_);
          bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar133._16_4_ =
               (float)((uint)bVar18 * auVar112._16_4_ | (uint)!bVar18 * auVar111._16_4_);
          bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar133._20_4_ =
               (float)((uint)bVar18 * auVar112._20_4_ | (uint)!bVar18 * auVar111._20_4_);
          bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar133._24_4_ =
               (float)((uint)bVar18 * auVar112._24_4_ | (uint)!bVar18 * auVar111._24_4_);
          bVar18 = SUB81(uVar81 >> 7,0);
          auVar133._28_4_ = (uint)bVar18 * auVar112._28_4_ | (uint)!bVar18 * auVar111._28_4_;
          bVar18 = (bool)((byte)uVar81 & 1);
          auVar134._0_4_ = (float)((uint)bVar18 * auVar113._0_4_ | (uint)!bVar18 * auVar120._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar120._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar120._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar120._12_4_);
          bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar134._16_4_ =
               (float)((uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * auVar120._16_4_);
          bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar134._20_4_ =
               (float)((uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * auVar120._20_4_);
          bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar134._24_4_ =
               (float)((uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * auVar120._24_4_);
          bVar18 = SUB81(uVar81 >> 7,0);
          auVar134._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar120._28_4_;
          vandps_avx512vl(auVar108,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar109 = vmaxps_avx(auVar134,auVar134);
          vandps_avx512vl(auVar107,auVar104);
          auVar109 = vmaxps_avx(auVar109,auVar134);
          uVar81 = vcmpps_avx512vl(auVar109,auVar78,1);
          bVar18 = (bool)((byte)uVar81 & 1);
          auVar135._0_4_ = (uint)bVar18 * auVar112._0_4_ | (uint)!bVar18 * auVar108._0_4_;
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar135._4_4_ = (uint)bVar18 * auVar112._4_4_ | (uint)!bVar18 * auVar108._4_4_;
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar135._8_4_ = (uint)bVar18 * auVar112._8_4_ | (uint)!bVar18 * auVar108._8_4_;
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar135._12_4_ = (uint)bVar18 * auVar112._12_4_ | (uint)!bVar18 * auVar108._12_4_;
          bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar135._16_4_ = (uint)bVar18 * auVar112._16_4_ | (uint)!bVar18 * auVar108._16_4_;
          bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar135._20_4_ = (uint)bVar18 * auVar112._20_4_ | (uint)!bVar18 * auVar108._20_4_;
          bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar135._24_4_ = (uint)bVar18 * auVar112._24_4_ | (uint)!bVar18 * auVar108._24_4_;
          bVar18 = SUB81(uVar81 >> 7,0);
          auVar135._28_4_ = (uint)bVar18 * auVar112._28_4_ | (uint)!bVar18 * auVar108._28_4_;
          bVar18 = (bool)((byte)uVar81 & 1);
          auVar136._0_4_ = (float)((uint)bVar18 * auVar113._0_4_ | (uint)!bVar18 * auVar103._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar103._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar103._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar103._12_4_);
          bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * auVar103._16_4_);
          bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * auVar103._20_4_);
          bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * auVar103._24_4_);
          bVar18 = SUB81(uVar81 >> 7,0);
          auVar136._28_4_ = (uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar103._28_4_;
          auVar208._8_4_ = 0x80000000;
          auVar208._0_8_ = 0x8000000080000000;
          auVar208._12_4_ = 0x80000000;
          auVar208._16_4_ = 0x80000000;
          auVar208._20_4_ = 0x80000000;
          auVar208._24_4_ = 0x80000000;
          auVar208._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar135,auVar208);
          auVar102 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          auVar107 = vfmadd213ps_avx512vl(auVar133,auVar133,ZEXT1632(auVar102));
          auVar99 = vfmadd231ps_fma(auVar107,auVar134,auVar134);
          auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
          auVar217._8_4_ = 0xbf000000;
          auVar217._0_8_ = 0xbf000000bf000000;
          auVar217._12_4_ = 0xbf000000;
          auVar217._16_4_ = 0xbf000000;
          auVar217._20_4_ = 0xbf000000;
          auVar217._24_4_ = 0xbf000000;
          auVar217._28_4_ = 0xbf000000;
          fVar170 = auVar107._0_4_;
          fVar154 = auVar107._4_4_;
          fVar167 = auVar107._8_4_;
          fVar168 = auVar107._12_4_;
          fVar179 = auVar107._16_4_;
          fVar178 = auVar107._20_4_;
          fVar190 = auVar107._24_4_;
          auVar57._4_4_ = fVar154 * fVar154 * fVar154 * auVar99._4_4_ * -0.5;
          auVar57._0_4_ = fVar170 * fVar170 * fVar170 * auVar99._0_4_ * -0.5;
          auVar57._8_4_ = fVar167 * fVar167 * fVar167 * auVar99._8_4_ * -0.5;
          auVar57._12_4_ = fVar168 * fVar168 * fVar168 * auVar99._12_4_ * -0.5;
          auVar57._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
          auVar57._20_4_ = fVar178 * fVar178 * fVar178 * -0.0;
          auVar57._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar57._28_4_ = auVar134._28_4_;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar107 = vfmadd231ps_avx512vl(auVar57,auVar108,auVar107);
          auVar58._4_4_ = auVar134._4_4_ * auVar107._4_4_;
          auVar58._0_4_ = auVar134._0_4_ * auVar107._0_4_;
          auVar58._8_4_ = auVar134._8_4_ * auVar107._8_4_;
          auVar58._12_4_ = auVar134._12_4_ * auVar107._12_4_;
          auVar58._16_4_ = auVar134._16_4_ * auVar107._16_4_;
          auVar58._20_4_ = auVar134._20_4_ * auVar107._20_4_;
          auVar58._24_4_ = auVar134._24_4_ * auVar107._24_4_;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = auVar107._4_4_ * -auVar133._4_4_;
          auVar59._0_4_ = auVar107._0_4_ * -auVar133._0_4_;
          auVar59._8_4_ = auVar107._8_4_ * -auVar133._8_4_;
          auVar59._12_4_ = auVar107._12_4_ * -auVar133._12_4_;
          auVar59._16_4_ = auVar107._16_4_ * -auVar133._16_4_;
          auVar59._20_4_ = auVar107._20_4_ * -auVar133._20_4_;
          auVar59._24_4_ = auVar107._24_4_ * -auVar133._24_4_;
          auVar59._28_4_ = auVar134._28_4_;
          auVar120 = vmulps_avx512vl(auVar107,ZEXT1632(auVar102));
          auVar118 = ZEXT1632(auVar102);
          auVar107 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar118);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar136,auVar136);
          auVar111 = vrsqrt14ps_avx512vl(auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar217);
          fVar170 = auVar111._0_4_;
          fVar154 = auVar111._4_4_;
          fVar167 = auVar111._8_4_;
          fVar168 = auVar111._12_4_;
          fVar179 = auVar111._16_4_;
          fVar178 = auVar111._20_4_;
          fVar190 = auVar111._24_4_;
          auVar60._4_4_ = fVar154 * fVar154 * fVar154 * auVar107._4_4_;
          auVar60._0_4_ = fVar170 * fVar170 * fVar170 * auVar107._0_4_;
          auVar60._8_4_ = fVar167 * fVar167 * fVar167 * auVar107._8_4_;
          auVar60._12_4_ = fVar168 * fVar168 * fVar168 * auVar107._12_4_;
          auVar60._16_4_ = fVar179 * fVar179 * fVar179 * auVar107._16_4_;
          auVar60._20_4_ = fVar178 * fVar178 * fVar178 * auVar107._20_4_;
          auVar60._24_4_ = fVar190 * fVar190 * fVar190 * auVar107._24_4_;
          auVar60._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar60,auVar108,auVar111);
          auVar61._4_4_ = auVar136._4_4_ * auVar107._4_4_;
          auVar61._0_4_ = auVar136._0_4_ * auVar107._0_4_;
          auVar61._8_4_ = auVar136._8_4_ * auVar107._8_4_;
          auVar61._12_4_ = auVar136._12_4_ * auVar107._12_4_;
          auVar61._16_4_ = auVar136._16_4_ * auVar107._16_4_;
          auVar61._20_4_ = auVar136._20_4_ * auVar107._20_4_;
          auVar61._24_4_ = auVar136._24_4_ * auVar107._24_4_;
          auVar61._28_4_ = auVar111._28_4_;
          auVar62._4_4_ = auVar107._4_4_ * auVar109._4_4_;
          auVar62._0_4_ = auVar107._0_4_ * auVar109._0_4_;
          auVar62._8_4_ = auVar107._8_4_ * auVar109._8_4_;
          auVar62._12_4_ = auVar107._12_4_ * auVar109._12_4_;
          auVar62._16_4_ = auVar107._16_4_ * auVar109._16_4_;
          auVar62._20_4_ = auVar107._20_4_ * auVar109._20_4_;
          auVar62._24_4_ = auVar107._24_4_ * auVar109._24_4_;
          auVar62._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(auVar107,auVar118);
          auVar99 = vfmadd213ps_fma(auVar58,auVar105,ZEXT1632(auVar100));
          auVar158 = vfmadd213ps_fma(auVar59,auVar105,ZEXT1632(auVar101));
          auVar108 = vfmadd213ps_avx512vl(auVar120,auVar105,auVar110);
          auVar111 = vfmadd213ps_avx512vl(auVar61,auVar106,ZEXT1632(auVar8));
          auVar95 = vfnmadd213ps_fma(auVar58,auVar105,ZEXT1632(auVar100));
          auVar100 = vfmadd213ps_fma(auVar62,auVar106,ZEXT1632(auVar9));
          auVar205 = vfnmadd213ps_fma(auVar59,auVar105,ZEXT1632(auVar101));
          auVar101 = vfmadd213ps_fma(auVar109,auVar106,auVar119);
          auVar29 = vfnmadd231ps_fma(auVar110,auVar105,auVar120);
          auVar180 = vfnmadd213ps_fma(auVar61,auVar106,ZEXT1632(auVar8));
          auVar96 = vfnmadd213ps_fma(auVar62,auVar106,ZEXT1632(auVar9));
          auVar97 = vfnmadd231ps_fma(auVar119,auVar106,auVar109);
          auVar119 = vsubps_avx512vl(auVar111,ZEXT1632(auVar95));
          auVar109 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar205));
          auVar107 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar29));
          auVar63._4_4_ = auVar109._4_4_ * auVar29._4_4_;
          auVar63._0_4_ = auVar109._0_4_ * auVar29._0_4_;
          auVar63._8_4_ = auVar109._8_4_ * auVar29._8_4_;
          auVar63._12_4_ = auVar109._12_4_ * auVar29._12_4_;
          auVar63._16_4_ = auVar109._16_4_ * 0.0;
          auVar63._20_4_ = auVar109._20_4_ * 0.0;
          auVar63._24_4_ = auVar109._24_4_ * 0.0;
          auVar63._28_4_ = auVar120._28_4_;
          auVar8 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar205),auVar107);
          auVar64._4_4_ = auVar107._4_4_ * auVar95._4_4_;
          auVar64._0_4_ = auVar107._0_4_ * auVar95._0_4_;
          auVar64._8_4_ = auVar107._8_4_ * auVar95._8_4_;
          auVar64._12_4_ = auVar107._12_4_ * auVar95._12_4_;
          auVar64._16_4_ = auVar107._16_4_ * 0.0;
          auVar64._20_4_ = auVar107._20_4_ * 0.0;
          auVar64._24_4_ = auVar107._24_4_ * 0.0;
          auVar64._28_4_ = auVar107._28_4_;
          auVar9 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar29),auVar119);
          auVar65._4_4_ = auVar205._4_4_ * auVar119._4_4_;
          auVar65._0_4_ = auVar205._0_4_ * auVar119._0_4_;
          auVar65._8_4_ = auVar205._8_4_ * auVar119._8_4_;
          auVar65._12_4_ = auVar205._12_4_ * auVar119._12_4_;
          auVar65._16_4_ = auVar119._16_4_ * 0.0;
          auVar65._20_4_ = auVar119._20_4_ * 0.0;
          auVar65._24_4_ = auVar119._24_4_ * 0.0;
          auVar65._28_4_ = auVar119._28_4_;
          auVar98 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar95),auVar109);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),auVar118,ZEXT1632(auVar9));
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar118,ZEXT1632(auVar8));
          auVar104 = ZEXT1632(auVar102);
          uVar81 = vcmpps_avx512vl(auVar109,auVar104,2);
          bVar80 = (byte)uVar81;
          fVar146 = (float)((uint)(bVar80 & 1) * auVar99._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar180._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar148 = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar180._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar150 = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar180._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar152 = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar180._12_4_);
          auVar118 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar146))));
          fVar147 = (float)((uint)(bVar80 & 1) * auVar158._0_4_ |
                           (uint)!(bool)(bVar80 & 1) * auVar96._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          fVar149 = (float)((uint)bVar18 * auVar158._4_4_ | (uint)!bVar18 * auVar96._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          fVar151 = (float)((uint)bVar18 * auVar158._8_4_ | (uint)!bVar18 * auVar96._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          fVar153 = (float)((uint)bVar18 * auVar158._12_4_ | (uint)!bVar18 * auVar96._12_4_);
          auVar112 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar147))));
          auVar137._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar97._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar97._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar97._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar137._12_4_ = (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar97._12_4_)
          ;
          fVar154 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar108._16_4_);
          auVar137._16_4_ = fVar154;
          fVar170 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar108._20_4_);
          auVar137._20_4_ = fVar170;
          fVar167 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar108._24_4_);
          auVar137._24_4_ = fVar167;
          iVar1 = (uint)(byte)(uVar81 >> 7) * auVar108._28_4_;
          auVar137._28_4_ = iVar1;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar95),auVar111);
          auVar138._0_4_ =
               (uint)(bVar80 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar8._0_4_;
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar8._4_4_;
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar8._8_4_;
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar8._12_4_;
          auVar138._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar109._16_4_;
          auVar138._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar109._20_4_;
          auVar138._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar109._24_4_;
          auVar138._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar205),ZEXT1632(auVar100));
          auVar139._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar99._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar99._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar99._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar139._12_4_ = (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar99._12_4_)
          ;
          fVar178 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar109._16_4_);
          auVar139._16_4_ = fVar178;
          fVar179 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar109._20_4_);
          auVar139._20_4_ = fVar179;
          fVar168 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar109._24_4_);
          auVar139._24_4_ = fVar168;
          auVar139._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar101));
          auVar140._0_4_ =
               (float)((uint)(bVar80 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar80 & 1) * auVar158._0_4_);
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar158._4_4_);
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar158._8_4_);
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar158._12_4_);
          fVar177 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar109._16_4_);
          auVar140._16_4_ = fVar177;
          fVar94 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar109._20_4_);
          auVar140._20_4_ = fVar94;
          fVar190 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar109._24_4_);
          auVar140._24_4_ = fVar190;
          iVar2 = (uint)(byte)(uVar81 >> 7) * auVar109._28_4_;
          auVar140._28_4_ = iVar2;
          auVar141._0_4_ =
               (uint)(bVar80 & 1) * (int)auVar95._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar111._0_4_;
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar18 * (int)auVar95._4_4_ | (uint)!bVar18 * auVar111._4_4_;
          bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar18 * (int)auVar95._8_4_ | (uint)!bVar18 * auVar111._8_4_;
          bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar18 * (int)auVar95._12_4_ | (uint)!bVar18 * auVar111._12_4_;
          auVar141._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar111._16_4_;
          auVar141._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar111._20_4_;
          auVar141._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar111._24_4_;
          auVar141._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar111._28_4_;
          bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar81 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar81 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar111 = vsubps_avx512vl(auVar141,auVar118);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar205._12_4_ |
                                                   (uint)!bVar22 * auVar100._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar205._8_4_ |
                                                            (uint)!bVar20 * auVar100._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar205._4_4_ |
                                                                     (uint)!bVar18 * auVar100._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar205._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar100._0_4_)))),auVar112);
          auVar201 = ZEXT3264(auVar107);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar29._12_4_ |
                                                   (uint)!bVar23 * auVar101._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar29._8_4_ |
                                                            (uint)!bVar21 * auVar101._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar29._4_4_ |
                                                                     (uint)!bVar19 * auVar101._4_4_,
                                                                     (uint)(bVar80 & 1) *
                                                                     (int)auVar29._0_4_ |
                                                                     (uint)!(bool)(bVar80 & 1) *
                                                                     auVar101._0_4_)))),auVar137);
          auVar120 = vsubps_avx(auVar118,auVar138);
          auVar204 = ZEXT3264(auVar120);
          auVar119 = vsubps_avx(auVar112,auVar139);
          auVar110 = vsubps_avx(auVar137,auVar140);
          auVar66._4_4_ = auVar108._4_4_ * fVar148;
          auVar66._0_4_ = auVar108._0_4_ * fVar146;
          auVar66._8_4_ = auVar108._8_4_ * fVar150;
          auVar66._12_4_ = auVar108._12_4_ * fVar152;
          auVar66._16_4_ = auVar108._16_4_ * 0.0;
          auVar66._20_4_ = auVar108._20_4_ * 0.0;
          auVar66._24_4_ = auVar108._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar100 = vfmsub231ps_fma(auVar66,auVar137,auVar111);
          auVar188._0_4_ = fVar147 * auVar111._0_4_;
          auVar188._4_4_ = fVar149 * auVar111._4_4_;
          auVar188._8_4_ = fVar151 * auVar111._8_4_;
          auVar188._12_4_ = fVar153 * auVar111._12_4_;
          auVar188._16_4_ = auVar111._16_4_ * 0.0;
          auVar188._20_4_ = auVar111._20_4_ * 0.0;
          auVar188._24_4_ = auVar111._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar188,auVar118,auVar107);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar104,ZEXT1632(auVar100));
          auVar194._0_4_ = auVar107._0_4_ * auVar137._0_4_;
          auVar194._4_4_ = auVar107._4_4_ * auVar137._4_4_;
          auVar194._8_4_ = auVar107._8_4_ * auVar137._8_4_;
          auVar194._12_4_ = auVar107._12_4_ * auVar137._12_4_;
          auVar194._16_4_ = auVar107._16_4_ * fVar154;
          auVar194._20_4_ = auVar107._20_4_ * fVar170;
          auVar194._24_4_ = auVar107._24_4_ * fVar167;
          auVar194._28_4_ = 0;
          auVar100 = vfmsub231ps_fma(auVar194,auVar112,auVar108);
          auVar113 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar100));
          auVar109 = vmulps_avx512vl(auVar110,auVar138);
          auVar109 = vfmsub231ps_avx512vl(auVar109,auVar120,auVar140);
          auVar67._4_4_ = auVar119._4_4_ * auVar140._4_4_;
          auVar67._0_4_ = auVar119._0_4_ * auVar140._0_4_;
          auVar67._8_4_ = auVar119._8_4_ * auVar140._8_4_;
          auVar67._12_4_ = auVar119._12_4_ * auVar140._12_4_;
          auVar67._16_4_ = auVar119._16_4_ * fVar177;
          auVar67._20_4_ = auVar119._20_4_ * fVar94;
          auVar67._24_4_ = auVar119._24_4_ * fVar190;
          auVar67._28_4_ = iVar2;
          auVar100 = vfmsub231ps_fma(auVar67,auVar139,auVar110);
          auVar195._0_4_ = auVar139._0_4_ * auVar120._0_4_;
          auVar195._4_4_ = auVar139._4_4_ * auVar120._4_4_;
          auVar195._8_4_ = auVar139._8_4_ * auVar120._8_4_;
          auVar195._12_4_ = auVar139._12_4_ * auVar120._12_4_;
          auVar195._16_4_ = fVar178 * auVar120._16_4_;
          auVar195._20_4_ = fVar179 * auVar120._20_4_;
          auVar195._24_4_ = fVar168 * auVar120._24_4_;
          auVar195._28_4_ = 0;
          auVar101 = vfmsub231ps_fma(auVar195,auVar119,auVar138);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar104,auVar109);
          auVar103 = vfmadd231ps_avx512vl(auVar109,auVar104,ZEXT1632(auVar100));
          auVar196 = ZEXT3264(auVar103);
          auVar109 = vmaxps_avx(auVar113,auVar103);
          uVar25 = vcmpps_avx512vl(auVar109,auVar104,2);
          bVar92 = bVar92 & (byte)uVar25;
          if (bVar92 != 0) {
            auVar68._4_4_ = auVar110._4_4_ * auVar107._4_4_;
            auVar68._0_4_ = auVar110._0_4_ * auVar107._0_4_;
            auVar68._8_4_ = auVar110._8_4_ * auVar107._8_4_;
            auVar68._12_4_ = auVar110._12_4_ * auVar107._12_4_;
            auVar68._16_4_ = auVar110._16_4_ * auVar107._16_4_;
            auVar68._20_4_ = auVar110._20_4_ * auVar107._20_4_;
            auVar68._24_4_ = auVar110._24_4_ * auVar107._24_4_;
            auVar68._28_4_ = auVar109._28_4_;
            auVar9 = vfmsub231ps_fma(auVar68,auVar119,auVar108);
            auVar69._4_4_ = auVar108._4_4_ * auVar120._4_4_;
            auVar69._0_4_ = auVar108._0_4_ * auVar120._0_4_;
            auVar69._8_4_ = auVar108._8_4_ * auVar120._8_4_;
            auVar69._12_4_ = auVar108._12_4_ * auVar120._12_4_;
            auVar69._16_4_ = auVar108._16_4_ * auVar120._16_4_;
            auVar69._20_4_ = auVar108._20_4_ * auVar120._20_4_;
            auVar69._24_4_ = auVar108._24_4_ * auVar120._24_4_;
            auVar69._28_4_ = auVar108._28_4_;
            auVar8 = vfmsub231ps_fma(auVar69,auVar111,auVar110);
            auVar70._4_4_ = auVar119._4_4_ * auVar111._4_4_;
            auVar70._0_4_ = auVar119._0_4_ * auVar111._0_4_;
            auVar70._8_4_ = auVar119._8_4_ * auVar111._8_4_;
            auVar70._12_4_ = auVar119._12_4_ * auVar111._12_4_;
            auVar70._16_4_ = auVar119._16_4_ * auVar111._16_4_;
            auVar70._20_4_ = auVar119._20_4_ * auVar111._20_4_;
            auVar70._24_4_ = auVar119._24_4_ * auVar111._24_4_;
            auVar70._28_4_ = auVar119._28_4_;
            auVar99 = vfmsub231ps_fma(auVar70,auVar120,auVar107);
            auVar100 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar99));
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar100),ZEXT1632(auVar9),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar101));
            auVar204 = ZEXT3264(auVar109);
            auVar35._8_4_ = 0x3f800000;
            auVar35._0_8_ = 0x3f8000003f800000;
            auVar35._12_4_ = 0x3f800000;
            auVar35._16_4_ = 0x3f800000;
            auVar35._20_4_ = 0x3f800000;
            auVar35._24_4_ = 0x3f800000;
            auVar35._28_4_ = 0x3f800000;
            auVar107 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar101),auVar35);
            auVar100 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
            auVar201 = ZEXT1664(auVar100);
            auVar71._4_4_ = auVar99._4_4_ * auVar137._4_4_;
            auVar71._0_4_ = auVar99._0_4_ * auVar137._0_4_;
            auVar71._8_4_ = auVar99._8_4_ * auVar137._8_4_;
            auVar71._12_4_ = auVar99._12_4_ * auVar137._12_4_;
            auVar71._16_4_ = fVar154 * 0.0;
            auVar71._20_4_ = fVar170 * 0.0;
            auVar71._24_4_ = fVar167 * 0.0;
            auVar71._28_4_ = iVar1;
            auVar8 = vfmadd231ps_fma(auVar71,auVar112,ZEXT1632(auVar8));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar118,ZEXT1632(auVar9));
            fVar170 = auVar100._0_4_;
            fVar154 = auVar100._4_4_;
            fVar167 = auVar100._8_4_;
            fVar168 = auVar100._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar168,
                                           CONCAT48(auVar8._8_4_ * fVar167,
                                                    CONCAT44(auVar8._4_4_ * fVar154,
                                                             auVar8._0_4_ * fVar170))));
            auVar206 = ZEXT3264(local_240);
            auVar79._4_4_ = uStack_43c;
            auVar79._0_4_ = local_440;
            auVar79._8_4_ = uStack_438;
            auVar79._12_4_ = uStack_434;
            auVar79._16_4_ = uStack_430;
            auVar79._20_4_ = uStack_42c;
            auVar79._24_4_ = uStack_428;
            auVar79._28_4_ = uStack_424;
            uVar25 = vcmpps_avx512vl(local_240,auVar79,0xd);
            uVar155 = *(undefined4 *)(ray + sVar91 * 4 + 0x80);
            auVar36._4_4_ = uVar155;
            auVar36._0_4_ = uVar155;
            auVar36._8_4_ = uVar155;
            auVar36._12_4_ = uVar155;
            auVar36._16_4_ = uVar155;
            auVar36._20_4_ = uVar155;
            auVar36._24_4_ = uVar155;
            auVar36._28_4_ = uVar155;
            uVar26 = vcmpps_avx512vl(local_240,auVar36,2);
            bVar92 = (byte)uVar25 & (byte)uVar26 & bVar92;
            if (bVar92 != 0) {
              uVar89 = vcmpps_avx512vl(ZEXT1632(auVar101),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar89 = bVar92 & uVar89;
              if ((char)uVar89 != '\0') {
                fVar179 = auVar113._0_4_ * fVar170;
                fVar178 = auVar113._4_4_ * fVar154;
                auVar72._4_4_ = fVar178;
                auVar72._0_4_ = fVar179;
                fVar190 = auVar113._8_4_ * fVar167;
                auVar72._8_4_ = fVar190;
                fVar94 = auVar113._12_4_ * fVar168;
                auVar72._12_4_ = fVar94;
                fVar177 = auVar113._16_4_ * 0.0;
                auVar72._16_4_ = fVar177;
                fVar146 = auVar113._20_4_ * 0.0;
                auVar72._20_4_ = fVar146;
                fVar147 = auVar113._24_4_ * 0.0;
                auVar72._24_4_ = fVar147;
                auVar72._28_4_ = auVar113._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar176,auVar72);
                local_280._0_4_ =
                     (float)((uint)(bVar80 & 1) * (int)fVar179 |
                            (uint)!(bool)(bVar80 & 1) * auVar109._0_4_);
                bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar18 * (int)fVar178 | (uint)!bVar18 * auVar109._4_4_);
                bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar18 * (int)fVar190 | (uint)!bVar18 * auVar109._8_4_);
                bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar18 * (int)fVar94 | (uint)!bVar18 * auVar109._12_4_);
                bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar18 * (int)fVar177 | (uint)!bVar18 * auVar109._16_4_);
                bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar18 * (int)fVar146 | (uint)!bVar18 * auVar109._20_4_);
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar109._24_4_);
                bVar18 = SUB81(uVar81 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar18 * auVar113._28_4_ | (uint)!bVar18 * auVar109._28_4_);
                auVar109 = vsubps_avx(auVar106,auVar105);
                auVar100 = vfmadd213ps_fma(auVar109,local_280,auVar105);
                uVar155 = *(undefined4 *)((long)pPVar86->ray_space + sVar91 * 4 + -0x10);
                auVar37._4_4_ = uVar155;
                auVar37._0_4_ = uVar155;
                auVar37._8_4_ = uVar155;
                auVar37._12_4_ = uVar155;
                auVar37._16_4_ = uVar155;
                auVar37._20_4_ = uVar155;
                auVar37._24_4_ = uVar155;
                auVar37._28_4_ = uVar155;
                auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar100._12_4_ + auVar100._12_4_,
                                                              CONCAT48(auVar100._8_4_ +
                                                                       auVar100._8_4_,
                                                                       CONCAT44(auVar100._4_4_ +
                                                                                auVar100._4_4_,
                                                                                auVar100._0_4_ +
                                                                                auVar100._0_4_)))),
                                           auVar37);
                uVar93 = vcmpps_avx512vl(local_240,auVar109,6);
                uVar89 = uVar89 & uVar93;
                bVar92 = (byte)uVar89;
                if (bVar92 != 0) {
                  auVar169._0_4_ = auVar103._0_4_ * fVar170;
                  auVar169._4_4_ = auVar103._4_4_ * fVar154;
                  auVar169._8_4_ = auVar103._8_4_ * fVar167;
                  auVar169._12_4_ = auVar103._12_4_ * fVar168;
                  auVar169._16_4_ = auVar103._16_4_ * 0.0;
                  auVar169._20_4_ = auVar103._20_4_ * 0.0;
                  auVar169._24_4_ = auVar103._24_4_ * 0.0;
                  auVar169._28_4_ = 0;
                  auVar189._8_4_ = 0x3f800000;
                  auVar189._0_8_ = 0x3f8000003f800000;
                  auVar189._12_4_ = 0x3f800000;
                  auVar189._16_4_ = 0x3f800000;
                  auVar189._20_4_ = 0x3f800000;
                  auVar189._24_4_ = 0x3f800000;
                  auVar189._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar189,auVar169);
                  auVar142._0_4_ =
                       (uint)(bVar80 & 1) * (int)auVar169._0_4_ |
                       (uint)!(bool)(bVar80 & 1) * auVar109._0_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
                  auVar142._4_4_ =
                       (uint)bVar18 * (int)auVar169._4_4_ | (uint)!bVar18 * auVar109._4_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
                  auVar142._8_4_ =
                       (uint)bVar18 * (int)auVar169._8_4_ | (uint)!bVar18 * auVar109._8_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                  auVar142._12_4_ =
                       (uint)bVar18 * (int)auVar169._12_4_ | (uint)!bVar18 * auVar109._12_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
                  auVar142._16_4_ =
                       (uint)bVar18 * (int)auVar169._16_4_ | (uint)!bVar18 * auVar109._16_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
                  auVar142._20_4_ =
                       (uint)bVar18 * (int)auVar169._20_4_ | (uint)!bVar18 * auVar109._20_4_;
                  bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                  auVar142._24_4_ =
                       (uint)bVar18 * (int)auVar169._24_4_ | (uint)!bVar18 * auVar109._24_4_;
                  auVar142._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar109._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar142,auVar189,auVar38);
                  local_220 = (int)lVar85;
                  local_21c = iVar15;
                  auVar204 = ZEXT1664(local_5a0);
                  local_210 = local_5a0;
                  local_200 = uVar24;
                  uStack_1f8 = uVar27;
                  local_1f0 = uVar74;
                  uStack_1e8 = uVar75;
                  local_1e0 = uVar76;
                  uStack_1d8 = uVar77;
                  pGVar87 = (context->scene->geometries).items[uVar14].ptr;
                  if ((pGVar87->mask & *(uint *)(ray + sVar91 * 4 + 0x90)) != 0) {
                    auVar100 = vcvtsi2ss_avx512f(auVar102,(int)lVar85);
                    fVar170 = auVar100._0_4_;
                    local_1c0[0] = (fVar170 + local_280._0_4_ + 0.0) * local_120;
                    local_1c0[1] = (fVar170 + local_280._4_4_ + 1.0) * fStack_11c;
                    local_1c0[2] = (fVar170 + local_280._8_4_ + 2.0) * fStack_118;
                    local_1c0[3] = (fVar170 + local_280._12_4_ + 3.0) * fStack_114;
                    fStack_1b0 = (fVar170 + local_280._16_4_ + 4.0) * fStack_110;
                    fStack_1ac = (fVar170 + local_280._20_4_ + 5.0) * fStack_10c;
                    fStack_1a8 = (fVar170 + local_280._24_4_ + 6.0) * fStack_108;
                    fStack_1a4 = fVar170 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar162._8_4_ = 0x7f800000;
                    auVar162._0_8_ = 0x7f8000007f800000;
                    auVar162._12_4_ = 0x7f800000;
                    auVar162._16_4_ = 0x7f800000;
                    auVar162._20_4_ = 0x7f800000;
                    auVar162._24_4_ = 0x7f800000;
                    auVar162._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar162,local_240);
                    auVar143._0_4_ =
                         (uint)(bVar92 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar143._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar143._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
                    auVar143._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
                    auVar143._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 5) & 1);
                    auVar143._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar89 >> 6) & 1);
                    auVar143._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar89 >> 7,0);
                    auVar143._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar109 = vshufps_avx(auVar143,auVar143,0xb1);
                    auVar109 = vminps_avx(auVar143,auVar109);
                    auVar107 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    auVar107 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar107);
                    uVar25 = vcmpps_avx512vl(auVar143,auVar109,0);
                    uVar82 = (uint)uVar89;
                    if ((bVar92 & (byte)uVar25) != 0) {
                      uVar82 = (uint)(bVar92 & (byte)uVar25);
                    }
                    uVar83 = 0;
                    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar81 = (ulong)uVar83;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar219._0_32_);
                      local_560 = ZEXT416(*(uint *)(ray + sVar91 * 4 + 0x80));
                      local_520._0_8_ = pGVar87;
                      local_548 = lVar84;
                      local_500 = local_240;
                      do {
                        local_3e0 = local_1c0[uVar81];
                        local_3d0 = *(undefined4 *)(local_1a0 + uVar81 * 4);
                        *(undefined4 *)(ray + sVar91 * 4 + 0x80) =
                             *(undefined4 *)(local_180 + uVar81 * 4);
                        local_590.context = context->user;
                        fVar154 = 1.0 - local_3e0;
                        fVar170 = fVar154 * fVar154 * -3.0;
                        auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                                   ZEXT416((uint)(local_3e0 * fVar154)),
                                                   ZEXT416(0xc0000000));
                        auVar101 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar154)),
                                                   ZEXT416((uint)(local_3e0 * local_3e0)),
                                                   ZEXT416(0x40000000));
                        fVar154 = auVar100._0_4_ * 3.0;
                        fVar167 = auVar101._0_4_ * 3.0;
                        fVar168 = local_3e0 * local_3e0 * 3.0;
                        auVar199._0_4_ = fVar168 * local_600;
                        auVar199._4_4_ = fVar168 * fStack_5fc;
                        auVar199._8_4_ = fVar168 * fStack_5f8;
                        auVar199._12_4_ = fVar168 * fStack_5f4;
                        auVar201 = ZEXT1664(auVar199);
                        auVar156._4_4_ = fVar167;
                        auVar156._0_4_ = fVar167;
                        auVar156._8_4_ = fVar167;
                        auVar156._12_4_ = fVar167;
                        auVar100 = vfmadd132ps_fma(auVar156,auVar199,auVar12);
                        auVar184._4_4_ = fVar154;
                        auVar184._0_4_ = fVar154;
                        auVar184._8_4_ = fVar154;
                        auVar184._12_4_ = fVar154;
                        auVar100 = vfmadd132ps_fma(auVar184,auVar100,auVar13);
                        auVar157._4_4_ = fVar170;
                        auVar157._0_4_ = fVar170;
                        auVar157._8_4_ = fVar170;
                        auVar157._12_4_ = fVar170;
                        auVar100 = vfmadd213ps_fma(auVar157,auVar204._0_16_,auVar100);
                        local_410 = auVar100._0_4_;
                        local_400 = vshufps_avx(auVar100,auVar100,0x55);
                        auVar196 = ZEXT1664(local_400);
                        local_3f0 = vshufps_avx(auVar100,auVar100,0xaa);
                        iStack_40c = local_410;
                        iStack_408 = local_410;
                        iStack_404 = local_410;
                        fStack_3dc = local_3e0;
                        fStack_3d8 = local_3e0;
                        fStack_3d4 = local_3e0;
                        uStack_3cc = local_3d0;
                        uStack_3c8 = local_3d0;
                        uStack_3c4 = local_3d0;
                        local_3c0 = local_4c0._0_8_;
                        uStack_3b8 = local_4c0._8_8_;
                        local_3b0 = local_4b0;
                        vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                        uStack_39c = (local_590.context)->instID[0];
                        local_3a0 = uStack_39c;
                        uStack_398 = uStack_39c;
                        uStack_394 = uStack_39c;
                        uStack_390 = (local_590.context)->instPrimID[0];
                        uStack_38c = uStack_390;
                        uStack_388 = uStack_390;
                        uStack_384 = uStack_390;
                        local_5d0 = local_4d0;
                        local_590.valid = (int *)local_5d0;
                        local_590.geometryUserPtr = pGVar87->userPtr;
                        local_590.hit = (RTCHitN *)&local_410;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar196 = ZEXT1664(local_400);
                          auVar201 = ZEXT1664(auVar199);
                          (*pGVar87->intersectionFilterN)(&local_590);
                          auVar206 = ZEXT3264(local_500);
                          auVar204 = ZEXT1664(local_5a0);
                          pGVar87 = (Geometry *)local_520._0_8_;
                        }
                        uVar93 = vptestmd_avx512vl(local_5d0,local_5d0);
                        if ((uVar93 & 0xf) == 0) {
LAB_01a891c2:
                          *(undefined4 *)(ray + sVar91 * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar87->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar196 = ZEXT1664(auVar196._0_16_);
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            (*p_Var17)(&local_590);
                            auVar206 = ZEXT3264(local_500);
                            auVar204 = ZEXT1664(local_5a0);
                            pGVar87 = (Geometry *)local_520._0_8_;
                          }
                          uVar93 = vptestmd_avx512vl(local_5d0,local_5d0);
                          uVar93 = uVar93 & 0xf;
                          bVar92 = (byte)uVar93;
                          if (bVar92 == 0) goto LAB_01a891c2;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar73 = *(int *)(local_590.hit + 0xc);
                          bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                          bVar20 = SUB81(uVar93 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar92 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar20 * iVar73 |
                               (uint)!bVar20 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar73 = *(int *)(local_590.hit + 0x1c);
                          bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                          bVar20 = SUB81(uVar93 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar20 * iVar73 |
                               (uint)!bVar20 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar73 = *(int *)(local_590.hit + 0x2c);
                          bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                          bVar20 = SUB81(uVar93 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar20 * iVar73 |
                               (uint)!bVar20 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar73 = *(int *)(local_590.hit + 0x3c);
                          bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                          bVar20 = SUB81(uVar93 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar20 * iVar73 |
                               (uint)!bVar20 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar73 = *(int *)(local_590.hit + 0x4c);
                          bVar18 = (bool)((byte)(uVar93 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar93 >> 2) & 1);
                          bVar20 = SUB81(uVar93 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar92 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar92 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar18 * iVar1 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar19 * iVar2 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar20 * iVar73 |
                               (uint)!bVar20 * *(int *)(local_590.ray + 0x10c);
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50)
                                                       );
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar100;
                          auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60)
                                                       );
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70)
                                                       );
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar100;
                          auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80)
                                                       );
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar100;
                          local_560._0_4_ = *(undefined4 *)(ray + sVar91 * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar92 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & (byte)uVar89;
                        auVar163._4_4_ = local_560._0_4_;
                        auVar163._0_4_ = local_560._0_4_;
                        auVar163._8_4_ = local_560._0_4_;
                        auVar163._12_4_ = local_560._0_4_;
                        auVar163._16_4_ = local_560._0_4_;
                        auVar163._20_4_ = local_560._0_4_;
                        auVar163._24_4_ = local_560._0_4_;
                        auVar163._28_4_ = local_560._0_4_;
                        uVar25 = vcmpps_avx512vl(auVar206._0_32_,auVar163,2);
                        if ((bVar92 & (byte)uVar25) == 0) goto LAB_01a89262;
                        bVar92 = bVar92 & (byte)uVar25;
                        uVar89 = (ulong)bVar92;
                        auVar164._8_4_ = 0x7f800000;
                        auVar164._0_8_ = 0x7f8000007f800000;
                        auVar164._12_4_ = 0x7f800000;
                        auVar164._16_4_ = 0x7f800000;
                        auVar164._20_4_ = 0x7f800000;
                        auVar164._24_4_ = 0x7f800000;
                        auVar164._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar164,auVar206._0_32_);
                        auVar144._0_4_ =
                             (uint)(bVar92 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar92 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 1 & 1);
                        auVar144._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 2 & 1);
                        auVar144._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 3 & 1);
                        auVar144._12_4_ =
                             (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 4 & 1);
                        auVar144._16_4_ =
                             (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 5 & 1);
                        auVar144._20_4_ =
                             (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar92 >> 6 & 1);
                        auVar144._24_4_ =
                             (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar144._28_4_ =
                             (uint)(bVar92 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar92 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar144,auVar144,0xb1);
                        auVar109 = vminps_avx(auVar144,auVar109);
                        auVar107 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        auVar107 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar107);
                        uVar25 = vcmpps_avx512vl(auVar144,auVar109,0);
                        bVar80 = (byte)uVar25 & bVar92;
                        if (bVar80 != 0) {
                          bVar92 = bVar80;
                        }
                        uVar82 = 0;
                        for (uVar83 = (uint)bVar92; (uVar83 & 1) == 0;
                            uVar83 = uVar83 >> 1 | 0x80000000) {
                          uVar82 = uVar82 + 1;
                        }
                        uVar81 = (ulong)uVar82;
                      } while( true );
                    }
                    fVar170 = local_1c0[uVar81];
                    uVar155 = *(undefined4 *)(local_1a0 + uVar81 * 4);
                    fVar167 = 1.0 - fVar170;
                    fVar154 = fVar167 * fVar167 * -3.0;
                    auVar196 = ZEXT464((uint)fVar154);
                    auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),
                                               ZEXT416((uint)(fVar170 * fVar167)),
                                               ZEXT416(0xc0000000));
                    auVar101 = vfmsub132ss_fma(ZEXT416((uint)(fVar170 * fVar167)),
                                               ZEXT416((uint)(fVar170 * fVar170)),
                                               ZEXT416(0x40000000));
                    fVar167 = auVar100._0_4_ * 3.0;
                    fVar168 = auVar101._0_4_ * 3.0;
                    fVar179 = fVar170 * fVar170 * 3.0;
                    auVar198._0_4_ = fVar179 * local_600;
                    auVar198._4_4_ = fVar179 * fStack_5fc;
                    auVar198._8_4_ = fVar179 * fStack_5f8;
                    auVar198._12_4_ = fVar179 * fStack_5f4;
                    auVar201 = ZEXT1664(auVar198);
                    auVar173._4_4_ = fVar168;
                    auVar173._0_4_ = fVar168;
                    auVar173._8_4_ = fVar168;
                    auVar173._12_4_ = fVar168;
                    auVar100 = vfmadd132ps_fma(auVar173,auVar198,auVar10);
                    auVar183._4_4_ = fVar167;
                    auVar183._0_4_ = fVar167;
                    auVar183._8_4_ = fVar167;
                    auVar183._12_4_ = fVar167;
                    auVar100 = vfmadd132ps_fma(auVar183,auVar100,auVar11);
                    auVar174._4_4_ = fVar154;
                    auVar174._0_4_ = fVar154;
                    auVar174._8_4_ = fVar154;
                    auVar174._12_4_ = fVar154;
                    auVar100 = vfmadd213ps_fma(auVar174,local_5a0,auVar100);
                    *(undefined4 *)(ray + sVar91 * 4 + 0x80) =
                         *(undefined4 *)(local_180 + uVar81 * 4);
                    *(int *)(ray + sVar91 * 4 + 0xc0) = auVar100._0_4_;
                    uVar16 = vextractps_avx(auVar100,1);
                    *(undefined4 *)(ray + sVar91 * 4 + 0xd0) = uVar16;
                    uVar16 = vextractps_avx(auVar100,2);
                    *(undefined4 *)(ray + sVar91 * 4 + 0xe0) = uVar16;
                    *(float *)(ray + sVar91 * 4 + 0xf0) = fVar170;
                    *(undefined4 *)(ray + sVar91 * 4 + 0x100) = uVar155;
                    *(int *)(ray + sVar91 * 4 + 0x110) = (int)local_5a8;
                    *(uint *)(ray + sVar91 * 4 + 0x120) = uVar14;
                    *(uint *)(ray + sVar91 * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + sVar91 * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a88eab;
      }
    }
    uVar155 = *(undefined4 *)(ray + sVar91 * 4 + 0x80);
    auVar34._4_4_ = uVar155;
    auVar34._0_4_ = uVar155;
    auVar34._8_4_ = uVar155;
    auVar34._12_4_ = uVar155;
    auVar34._16_4_ = uVar155;
    auVar34._20_4_ = uVar155;
    auVar34._24_4_ = uVar155;
    auVar34._28_4_ = uVar155;
    uVar24 = vcmpps_avx512vl(local_80,auVar34,2);
    uVar88 = (ulong)((uint)uVar88 & (uint)uVar24);
  } while( true );
LAB_01a89262:
  auVar218 = ZEXT3264(local_480);
  auVar220 = ZEXT3264(local_4a0);
  auVar109 = vmovdqa64_avx512vl(local_140);
  auVar219 = ZEXT3264(auVar109);
  lVar84 = local_548;
  pPVar86 = local_5b8;
  prim = local_5b0;
LAB_01a88eab:
  lVar85 = lVar85 + 8;
  goto LAB_01a885f8;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }